

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined6 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  int iVar62;
  undefined4 uVar63;
  ulong uVar64;
  long lVar65;
  undefined4 uVar70;
  undefined8 uVar66;
  RayK<4> *pRVar67;
  undefined1 (*pauVar68) [16];
  RTCFilterFunctionN p_Var69;
  RTCIntersectArguments *pRVar71;
  ulong uVar72;
  long lVar73;
  bool bVar74;
  ulong uVar75;
  int iVar76;
  ulong uVar77;
  bool bVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  short sVar83;
  undefined2 uVar121;
  float fVar84;
  float fVar122;
  float fVar123;
  __m128 a_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float pp;
  float fVar124;
  float fVar160;
  float fVar161;
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar173;
  float fVar174;
  vfloat4 v;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar175;
  float fVar193;
  float fVar194;
  vfloat4 v_1;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar199;
  float fVar200;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar227;
  float fVar228;
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar242;
  float fVar243;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  float fVar244;
  float fVar253;
  float fVar254;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar260;
  float fVar261;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar262;
  float fVar273;
  float fVar274;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar275;
  float fVar280;
  float fVar281;
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar290 [16];
  float fVar297;
  float fVar305;
  float fVar306;
  __m128 a_2;
  float fVar307;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar322;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar329 [16];
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined8 local_5a8;
  undefined1 local_598 [16];
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [4];
  float fStack_534;
  undefined8 uStack_530;
  RTCRayQueryContext *local_528;
  RayK<4> *local_520;
  RTCHitN *local_518;
  uint local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  undefined4 uStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 (*local_478) [16];
  ulong local_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  Primitive *local_398;
  ulong local_390;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 uVar120;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  
  PVar18 = prim[1];
  uVar64 = (ulong)(byte)PVar18;
  lVar22 = uVar64 * 0x25;
  pPVar9 = prim + lVar22 + 6;
  fVar174 = *(float *)(pPVar9 + 0xc);
  fVar175 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar174;
  fVar193 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar174;
  fVar194 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar174;
  fVar162 = *(float *)(ray + k * 4 + 0x40) * fVar174;
  fVar173 = *(float *)(ray + k * 4 + 0x50) * fVar174;
  fVar174 = *(float *)(ray + k * 4 + 0x60) * fVar174;
  uVar63 = *(undefined4 *)(prim + uVar64 * 4 + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar77;
  auVar267._12_2_ = uVar121;
  auVar267._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar164._12_4_ = auVar267._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar77;
  auVar164._10_2_ = uVar121;
  auVar85._10_6_ = auVar164._10_6_;
  auVar85._8_2_ = uVar121;
  auVar85._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar41._4_8_ = auVar85._8_8_;
  auVar41._2_2_ = uVar121;
  auVar41._0_2_ = uVar121;
  fVar308 = (float)((int)sVar83 >> 8);
  fVar316 = (float)(auVar41._0_4_ >> 0x18);
  fVar318 = (float)(auVar85._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 5 + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar77;
  auVar127._12_2_ = uVar121;
  auVar127._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar77;
  auVar126._10_2_ = uVar121;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar121;
  auVar125._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar42._4_8_ = auVar125._8_8_;
  auVar42._2_2_ = uVar121;
  auVar42._0_2_ = uVar121;
  fVar195 = (float)((int)sVar83 >> 8);
  fVar199 = (float)(auVar42._0_4_ >> 0x18);
  fVar200 = (float)(auVar125._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 6 + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar77;
  auVar130._12_2_ = uVar121;
  auVar130._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar77;
  auVar129._10_2_ = uVar121;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar121;
  auVar128._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar43._4_8_ = auVar128._8_8_;
  auVar43._2_2_ = uVar121;
  auVar43._0_2_ = uVar121;
  fVar229 = (float)((int)sVar83 >> 8);
  fVar242 = (float)(auVar43._0_4_ >> 0x18);
  fVar243 = (float)(auVar128._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0xf + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar77;
  auVar133._12_2_ = uVar121;
  auVar133._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar77;
  auVar132._10_2_ = uVar121;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar121;
  auVar131._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar44._4_8_ = auVar131._8_8_;
  auVar44._2_2_ = uVar121;
  auVar44._0_2_ = uVar121;
  fVar84 = (float)((int)sVar83 >> 8);
  fVar122 = (float)(auVar44._0_4_ >> 0x18);
  fVar123 = (float)(auVar131._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar77;
  auVar204._12_2_ = uVar121;
  auVar204._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar77;
  auVar203._10_2_ = uVar121;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar121;
  auVar202._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar45._4_8_ = auVar202._8_8_;
  auVar45._2_2_ = uVar121;
  auVar45._0_2_ = uVar121;
  fVar244 = (float)((int)sVar83 >> 8);
  fVar253 = (float)(auVar45._0_4_ >> 0x18);
  fVar254 = (float)(auVar202._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar64 + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar77;
  auVar207._12_2_ = uVar121;
  auVar207._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar77;
  auVar206._10_2_ = uVar121;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar121;
  auVar205._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar46._4_8_ = auVar205._8_8_;
  auVar46._2_2_ = uVar121;
  auVar46._0_2_ = uVar121;
  fVar262 = (float)((int)sVar83 >> 8);
  fVar273 = (float)(auVar46._0_4_ >> 0x18);
  fVar274 = (float)(auVar205._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1a + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar77;
  auVar210._12_2_ = uVar121;
  auVar210._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar77;
  auVar209._10_2_ = uVar121;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar121;
  auVar208._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar47._4_8_ = auVar208._8_8_;
  auVar47._2_2_ = uVar121;
  auVar47._0_2_ = uVar121;
  fVar255 = (float)((int)sVar83 >> 8);
  fVar260 = (float)(auVar47._0_4_ >> 0x18);
  fVar261 = (float)(auVar208._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1b + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar77;
  auVar213._12_2_ = uVar121;
  auVar213._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar77;
  auVar212._10_2_ = uVar121;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar121;
  auVar211._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar48._4_8_ = auVar211._8_8_;
  auVar48._2_2_ = uVar121;
  auVar48._0_2_ = uVar121;
  fVar275 = (float)((int)sVar83 >> 8);
  fVar280 = (float)(auVar48._0_4_ >> 0x18);
  fVar281 = (float)(auVar211._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1c + 6);
  uVar120 = (undefined1)((uint)uVar63 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar63 >> 0x10);
  uVar66 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar63));
  uVar120 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar66 >> 0x20),uVar120),uVar120);
  sVar83 = CONCAT11((char)uVar63,(char)uVar63);
  uVar77 = CONCAT62(uVar40,sVar83);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar77;
  auVar216._12_2_ = uVar121;
  auVar216._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar66 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar77;
  auVar215._10_2_ = uVar121;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar121;
  auVar214._0_8_ = uVar77;
  uVar121 = (undefined2)uVar40;
  auVar49._4_8_ = auVar214._8_8_;
  auVar49._2_2_ = uVar121;
  auVar49._0_2_ = uVar121;
  fVar124 = (float)((int)sVar83 >> 8);
  fVar160 = (float)(auVar49._0_4_ >> 0x18);
  fVar161 = (float)(auVar214._8_4_ >> 0x18);
  fVar297 = fVar162 * fVar308 + fVar173 * fVar195 + fVar174 * fVar229;
  fVar305 = fVar162 * fVar316 + fVar173 * fVar199 + fVar174 * fVar242;
  fVar306 = fVar162 * fVar318 + fVar173 * fVar200 + fVar174 * fVar243;
  fVar307 = fVar162 * (float)(auVar164._12_4_ >> 0x18) +
            fVar173 * (float)(auVar126._12_4_ >> 0x18) + fVar174 * (float)(auVar129._12_4_ >> 0x18);
  fVar283 = fVar162 * fVar84 + fVar173 * fVar244 + fVar174 * fVar262;
  fVar291 = fVar162 * fVar122 + fVar173 * fVar253 + fVar174 * fVar273;
  fVar293 = fVar162 * fVar123 + fVar173 * fVar254 + fVar174 * fVar274;
  fVar295 = fVar162 * (float)(auVar132._12_4_ >> 0x18) +
            fVar173 * (float)(auVar203._12_4_ >> 0x18) + fVar174 * (float)(auVar206._12_4_ >> 0x18);
  fVar201 = fVar162 * fVar255 + fVar173 * fVar275 + fVar174 * fVar124;
  fVar227 = fVar162 * fVar260 + fVar173 * fVar280 + fVar174 * fVar160;
  fVar228 = fVar162 * fVar261 + fVar173 * fVar281 + fVar174 * fVar161;
  fVar162 = fVar162 * (float)(auVar209._12_4_ >> 0x18) +
            fVar173 * (float)(auVar212._12_4_ >> 0x18) + fVar174 * (float)(auVar215._12_4_ >> 0x18);
  fVar309 = fVar308 * fVar175 + fVar195 * fVar193 + fVar229 * fVar194;
  fVar316 = fVar316 * fVar175 + fVar199 * fVar193 + fVar242 * fVar194;
  fVar318 = fVar318 * fVar175 + fVar200 * fVar193 + fVar243 * fVar194;
  fVar320 = (float)(auVar164._12_4_ >> 0x18) * fVar175 +
            (float)(auVar126._12_4_ >> 0x18) * fVar193 + (float)(auVar129._12_4_ >> 0x18) * fVar194;
  fVar262 = fVar84 * fVar175 + fVar244 * fVar193 + fVar262 * fVar194;
  fVar273 = fVar122 * fVar175 + fVar253 * fVar193 + fVar273 * fVar194;
  fVar274 = fVar123 * fVar175 + fVar254 * fVar193 + fVar274 * fVar194;
  fVar308 = (float)(auVar132._12_4_ >> 0x18) * fVar175 +
            (float)(auVar203._12_4_ >> 0x18) * fVar193 + (float)(auVar206._12_4_ >> 0x18) * fVar194;
  fVar255 = fVar175 * fVar255 + fVar193 * fVar275 + fVar194 * fVar124;
  fVar260 = fVar175 * fVar260 + fVar193 * fVar280 + fVar194 * fVar160;
  fVar261 = fVar175 * fVar261 + fVar193 * fVar281 + fVar194 * fVar161;
  fVar275 = fVar175 * (float)(auVar209._12_4_ >> 0x18) +
            fVar193 * (float)(auVar212._12_4_ >> 0x18) + fVar194 * (float)(auVar215._12_4_ >> 0x18);
  fVar174 = (float)DAT_01f80d30;
  fVar84 = DAT_01f80d30._4_4_;
  fVar122 = DAT_01f80d30._8_4_;
  fVar123 = DAT_01f80d30._12_4_;
  uVar79 = -(uint)(fVar174 <= ABS(fVar297));
  uVar80 = -(uint)(fVar84 <= ABS(fVar305));
  uVar81 = -(uint)(fVar122 <= ABS(fVar306));
  uVar82 = -(uint)(fVar123 <= ABS(fVar307));
  auVar298._0_4_ = (uint)fVar297 & uVar79;
  auVar298._4_4_ = (uint)fVar305 & uVar80;
  auVar298._8_4_ = (uint)fVar306 & uVar81;
  auVar298._12_4_ = (uint)fVar307 & uVar82;
  auVar176._0_4_ = ~uVar79 & (uint)fVar174;
  auVar176._4_4_ = ~uVar80 & (uint)fVar84;
  auVar176._8_4_ = ~uVar81 & (uint)fVar122;
  auVar176._12_4_ = ~uVar82 & (uint)fVar123;
  auVar176 = auVar176 | auVar298;
  uVar79 = -(uint)(fVar174 <= ABS(fVar283));
  uVar80 = -(uint)(fVar84 <= ABS(fVar291));
  uVar81 = -(uint)(fVar122 <= ABS(fVar293));
  uVar82 = -(uint)(fVar123 <= ABS(fVar295));
  auVar285._0_4_ = (uint)fVar283 & uVar79;
  auVar285._4_4_ = (uint)fVar291 & uVar80;
  auVar285._8_4_ = (uint)fVar293 & uVar81;
  auVar285._12_4_ = (uint)fVar295 & uVar82;
  auVar230._0_4_ = ~uVar79 & (uint)fVar174;
  auVar230._4_4_ = ~uVar80 & (uint)fVar84;
  auVar230._8_4_ = ~uVar81 & (uint)fVar122;
  auVar230._12_4_ = ~uVar82 & (uint)fVar123;
  auVar230 = auVar230 | auVar285;
  uVar79 = -(uint)(fVar174 <= ABS(fVar201));
  uVar80 = -(uint)(fVar84 <= ABS(fVar227));
  uVar81 = -(uint)(fVar122 <= ABS(fVar228));
  uVar82 = -(uint)(fVar123 <= ABS(fVar162));
  auVar217._0_4_ = (uint)fVar201 & uVar79;
  auVar217._4_4_ = (uint)fVar227 & uVar80;
  auVar217._8_4_ = (uint)fVar228 & uVar81;
  auVar217._12_4_ = (uint)fVar162 & uVar82;
  auVar245._0_4_ = ~uVar79 & (uint)fVar174;
  auVar245._4_4_ = ~uVar80 & (uint)fVar84;
  auVar245._8_4_ = ~uVar81 & (uint)fVar122;
  auVar245._12_4_ = ~uVar82 & (uint)fVar123;
  auVar245 = auVar245 | auVar217;
  auVar85 = rcpps(_DAT_01f80d30,auVar176);
  fVar174 = auVar85._0_4_;
  fVar123 = auVar85._4_4_;
  fVar195 = auVar85._8_4_;
  fVar244 = auVar85._12_4_;
  fVar174 = (1.0 - auVar176._0_4_ * fVar174) * fVar174 + fVar174;
  fVar123 = (1.0 - auVar176._4_4_ * fVar123) * fVar123 + fVar123;
  fVar195 = (1.0 - auVar176._8_4_ * fVar195) * fVar195 + fVar195;
  fVar244 = (1.0 - auVar176._12_4_ * fVar244) * fVar244 + fVar244;
  auVar85 = rcpps(auVar85,auVar230);
  fVar84 = auVar85._0_4_;
  fVar124 = auVar85._4_4_;
  fVar199 = auVar85._8_4_;
  fVar253 = auVar85._12_4_;
  fVar84 = (1.0 - auVar230._0_4_ * fVar84) * fVar84 + fVar84;
  fVar124 = (1.0 - auVar230._4_4_ * fVar124) * fVar124 + fVar124;
  fVar199 = (1.0 - auVar230._8_4_ * fVar199) * fVar199 + fVar199;
  fVar253 = (1.0 - auVar230._12_4_ * fVar253) * fVar253 + fVar253;
  auVar85 = rcpps(auVar85,auVar245);
  fVar122 = auVar85._0_4_;
  fVar160 = auVar85._4_4_;
  fVar200 = auVar85._8_4_;
  fVar254 = auVar85._12_4_;
  fVar122 = (1.0 - auVar245._0_4_ * fVar122) * fVar122 + fVar122;
  fVar160 = (1.0 - auVar245._4_4_ * fVar160) * fVar160 + fVar160;
  fVar200 = (1.0 - auVar245._8_4_ * fVar200) * fVar200 + fVar200;
  fVar254 = (1.0 - auVar245._12_4_ * fVar254) * fVar254 + fVar254;
  fVar280 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar77 = *(ulong *)(prim + uVar64 * 7 + 6);
  uVar121 = (undefined2)(uVar77 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar77;
  auVar86._12_2_ = uVar121;
  auVar86._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar77 >> 0x20);
  auVar232._12_4_ = auVar86._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar77;
  auVar232._10_2_ = uVar121;
  auVar251._10_6_ = auVar232._10_6_;
  auVar251._8_2_ = uVar121;
  auVar251._0_8_ = uVar77;
  uVar121 = (undefined2)(uVar77 >> 0x10);
  auVar50._4_8_ = auVar251._8_8_;
  auVar50._2_2_ = uVar121;
  auVar50._0_2_ = uVar121;
  fVar161 = (float)(auVar50._0_4_ >> 0x10);
  fVar201 = (float)(auVar251._8_4_ >> 0x10);
  uVar75 = *(ulong *)(prim + uVar64 * 0xb + 6);
  uVar121 = (undefined2)(uVar75 >> 0x30);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar75;
  auVar179._12_2_ = uVar121;
  auVar179._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar75 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar75;
  auVar178._10_2_ = uVar121;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar121;
  auVar177._0_8_ = uVar75;
  uVar121 = (undefined2)(uVar75 >> 0x10);
  auVar51._4_8_ = auVar177._8_8_;
  auVar51._2_2_ = uVar121;
  auVar51._0_2_ = uVar121;
  uVar10 = *(ulong *)(prim + uVar64 * 9 + 6);
  uVar121 = (undefined2)(uVar10 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar10;
  auVar89._12_2_ = uVar121;
  auVar89._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar10 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar10;
  auVar88._10_2_ = uVar121;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar121;
  auVar87._0_8_ = uVar10;
  uVar121 = (undefined2)(uVar10 >> 0x10);
  auVar52._4_8_ = auVar87._8_8_;
  auVar52._2_2_ = uVar121;
  auVar52._0_2_ = uVar121;
  fVar162 = (float)(auVar52._0_4_ >> 0x10);
  fVar227 = (float)(auVar87._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar64 * 0xd + 6);
  uVar121 = (undefined2)(uVar11 >> 0x30);
  auVar248._8_4_ = 0;
  auVar248._0_8_ = uVar11;
  auVar248._12_2_ = uVar121;
  auVar248._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar11 >> 0x20);
  auVar247._12_4_ = auVar248._12_4_;
  auVar247._8_2_ = 0;
  auVar247._0_8_ = uVar11;
  auVar247._10_2_ = uVar121;
  auVar246._10_6_ = auVar247._10_6_;
  auVar246._8_2_ = uVar121;
  auVar246._0_8_ = uVar11;
  uVar121 = (undefined2)(uVar11 >> 0x10);
  auVar53._4_8_ = auVar246._8_8_;
  auVar53._2_2_ = uVar121;
  auVar53._0_2_ = uVar121;
  uVar12 = *(ulong *)(prim + uVar64 * 0x12 + 6);
  uVar121 = (undefined2)(uVar12 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar12;
  auVar92._12_2_ = uVar121;
  auVar92._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar12 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar12;
  auVar91._10_2_ = uVar121;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar121;
  auVar90._0_8_ = uVar12;
  uVar121 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar90._8_8_;
  auVar54._2_2_ = uVar121;
  auVar54._0_2_ = uVar121;
  fVar173 = (float)(auVar54._0_4_ >> 0x10);
  fVar228 = (float)(auVar90._8_4_ >> 0x10);
  uVar72 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar64 * 2 + uVar72 + 6);
  uVar121 = (undefined2)(uVar13 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar13;
  auVar265._12_2_ = uVar121;
  auVar265._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar13 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar13;
  auVar264._10_2_ = uVar121;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar121;
  auVar263._0_8_ = uVar13;
  uVar121 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar263._8_8_;
  auVar55._2_2_ = uVar121;
  auVar55._0_2_ = uVar121;
  uVar72 = *(ulong *)(prim + uVar72 + 6);
  uVar121 = (undefined2)(uVar72 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar72;
  auVar95._12_2_ = uVar121;
  auVar95._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar72 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar72;
  auVar94._10_2_ = uVar121;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar121;
  auVar93._0_8_ = uVar72;
  uVar121 = (undefined2)(uVar72 >> 0x10);
  auVar56._4_8_ = auVar93._8_8_;
  auVar56._2_2_ = uVar121;
  auVar56._0_2_ = uVar121;
  fVar175 = (float)(auVar56._0_4_ >> 0x10);
  fVar229 = (float)(auVar93._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar64 * 0x18 + 6);
  uVar121 = (undefined2)(uVar14 >> 0x30);
  auVar278._8_4_ = 0;
  auVar278._0_8_ = uVar14;
  auVar278._12_2_ = uVar121;
  auVar278._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar14 >> 0x20);
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._8_2_ = 0;
  auVar277._0_8_ = uVar14;
  auVar277._10_2_ = uVar121;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._8_2_ = uVar121;
  auVar276._0_8_ = uVar14;
  uVar121 = (undefined2)(uVar14 >> 0x10);
  auVar57._4_8_ = auVar276._8_8_;
  auVar57._2_2_ = uVar121;
  auVar57._0_2_ = uVar121;
  uVar15 = *(ulong *)(prim + uVar64 * 0x1d + 6);
  uVar121 = (undefined2)(uVar15 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar15;
  auVar98._12_2_ = uVar121;
  auVar98._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar15 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar15;
  auVar97._10_2_ = uVar121;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar121;
  auVar96._0_8_ = uVar15;
  uVar121 = (undefined2)(uVar15 >> 0x10);
  auVar58._4_8_ = auVar96._8_8_;
  auVar58._2_2_ = uVar121;
  auVar58._0_2_ = uVar121;
  fVar193 = (float)(auVar58._0_4_ >> 0x10);
  fVar242 = (float)(auVar96._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar121 = (undefined2)(uVar16 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar16;
  auVar288._12_2_ = uVar121;
  auVar288._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar16 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar16;
  auVar287._10_2_ = uVar121;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar121;
  auVar286._0_8_ = uVar16;
  uVar121 = (undefined2)(uVar16 >> 0x10);
  auVar59._4_8_ = auVar286._8_8_;
  auVar59._2_2_ = uVar121;
  auVar59._0_2_ = uVar121;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar64) + 6);
  uVar121 = (undefined2)(uVar17 >> 0x30);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar17;
  auVar101._12_2_ = uVar121;
  auVar101._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar17 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar17;
  auVar100._10_2_ = uVar121;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar121;
  auVar99._0_8_ = uVar17;
  uVar121 = (undefined2)(uVar17 >> 0x10);
  auVar60._4_8_ = auVar99._8_8_;
  auVar60._2_2_ = uVar121;
  auVar60._0_2_ = uVar121;
  fVar194 = (float)(auVar60._0_4_ >> 0x10);
  fVar243 = (float)(auVar99._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar64 * 0x23 + 6);
  uVar121 = (undefined2)(uVar64 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar64;
  auVar301._12_2_ = uVar121;
  auVar301._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar64 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar64;
  auVar300._10_2_ = uVar121;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar121;
  auVar299._0_8_ = uVar64;
  uVar121 = (undefined2)(uVar64 >> 0x10);
  auVar61._4_8_ = auVar299._8_8_;
  auVar61._2_2_ = uVar121;
  auVar61._0_2_ = uVar121;
  auVar180._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar161) * fVar280 + fVar161) - fVar316) *
                fVar123,((((float)(int)(short)uVar75 - (float)(int)(short)uVar77) * fVar280 +
                         (float)(int)(short)uVar77) - fVar309) * fVar174);
  auVar180._8_4_ =
       ((((float)(auVar177._8_4_ >> 0x10) - fVar201) * fVar280 + fVar201) - fVar318) * fVar195;
  auVar180._12_4_ =
       ((((float)(auVar178._12_4_ >> 0x10) - (float)(auVar232._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar232._12_4_ >> 0x10)) - fVar320) * fVar244;
  auVar249._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar280 +
        (float)(int)(short)uVar10) - fVar309) * fVar174;
  auVar249._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar162) * fVar280 + fVar162) - fVar316) * fVar123;
  auVar249._8_4_ =
       ((((float)(auVar246._8_4_ >> 0x10) - fVar227) * fVar280 + fVar227) - fVar318) * fVar195;
  auVar249._12_4_ =
       ((((float)(auVar247._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar320) * fVar244;
  auVar266._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar173) * fVar280 + fVar173) - fVar273) *
                fVar124,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar280 +
                         (float)(int)(short)uVar12) - fVar262) * fVar84);
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar228) * fVar280 + fVar228) - fVar274) * fVar199;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar308) * fVar253;
  auVar279._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar72) * fVar280 +
        (float)(int)(short)uVar72) - fVar262) * fVar84;
  auVar279._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar175) * fVar280 + fVar175) - fVar273) * fVar124;
  auVar279._8_4_ =
       ((((float)(auVar276._8_4_ >> 0x10) - fVar229) * fVar280 + fVar229) - fVar274) * fVar199;
  auVar279._12_4_ =
       ((((float)(auVar277._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar308) * fVar253;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar289._0_8_ =
       CONCAT44(((((float)(auVar59._0_4_ >> 0x10) - fVar193) * fVar280 + fVar193) - fVar260) *
                fVar160,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar280 +
                         (float)(int)(short)uVar15) - fVar255) * fVar122);
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar242) * fVar280 + fVar242) - fVar261) * fVar200;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar97._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar97._12_4_ >> 0x10)) - fVar275) * fVar254;
  auVar302._0_4_ =
       ((((float)(int)(short)uVar64 - (float)(int)(short)uVar17) * fVar280 +
        (float)(int)(short)uVar17) - fVar255) * fVar122;
  auVar302._4_4_ =
       ((((float)(auVar61._0_4_ >> 0x10) - fVar194) * fVar280 + fVar194) - fVar260) * fVar160;
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar243) * fVar280 + fVar243) - fVar261) * fVar200;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar100._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar100._12_4_ >> 0x10)) - fVar275) * fVar254;
  auVar163._8_4_ = auVar180._8_4_;
  auVar163._0_8_ = auVar180._0_8_;
  auVar163._12_4_ = auVar180._12_4_;
  auVar164 = minps(auVar163,auVar249);
  auVar134._8_4_ = auVar266._8_4_;
  auVar134._0_8_ = auVar266._0_8_;
  auVar134._12_4_ = auVar266._12_4_;
  auVar85 = minps(auVar134,auVar279);
  auVar164 = maxps(auVar164,auVar85);
  auVar135._8_4_ = auVar289._8_4_;
  auVar135._0_8_ = auVar289._0_8_;
  auVar135._12_4_ = auVar289._12_4_;
  auVar85 = minps(auVar135,auVar302);
  auVar102._4_4_ = uVar63;
  auVar102._0_4_ = uVar63;
  auVar102._8_4_ = uVar63;
  auVar102._12_4_ = uVar63;
  auVar85 = maxps(auVar85,auVar102);
  auVar85 = maxps(auVar164,auVar85);
  auVar164 = maxps(auVar180,auVar249);
  auVar267 = maxps(auVar266,auVar279);
  auVar164 = minps(auVar164,auVar267);
  local_298 = auVar85._0_4_ * 0.99999964;
  fStack_294 = auVar85._4_4_ * 0.99999964;
  fStack_290 = auVar85._8_4_ * 0.99999964;
  fStack_28c = auVar85._12_4_ * 0.99999964;
  auVar85 = maxps(auVar289,auVar302);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar63;
  auVar103._0_4_ = uVar63;
  auVar103._8_4_ = uVar63;
  auVar103._12_4_ = uVar63;
  auVar85 = minps(auVar85,auVar103);
  auVar85 = minps(auVar164,auVar85);
  uVar79 = (uint)(byte)PVar18;
  auVar136._0_4_ = -(uint)(uVar79 != 0 && local_298 <= auVar85._0_4_ * 1.0000004);
  auVar136._4_4_ = -(uint)(1 < uVar79 && fStack_294 <= auVar85._4_4_ * 1.0000004);
  auVar136._8_4_ = -(uint)(2 < uVar79 && fStack_290 <= auVar85._8_4_ * 1.0000004);
  auVar136._12_4_ = -(uint)(3 < uVar79 && fStack_28c <= auVar85._12_4_ * 1.0000004);
  uVar79 = movmskps(uVar79,auVar136);
  if (uVar79 == 0) {
    return false;
  }
  uVar79 = uVar79 & 0xff;
  local_218._0_12_ = mm_lookupmask_ps._240_12_;
  local_218._12_4_ = 0;
  local_478 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_398 = prim;
LAB_00adfe12:
  local_390 = (ulong)uVar79;
  lVar22 = 0;
  if (local_390 != 0) {
    for (; (uVar79 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
    }
  }
  uVar79 = *(uint *)(local_398 + 2);
  uVar80 = *(uint *)(local_398 + lVar22 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar79].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar80 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_548 = pGVar19->fnumTimeSegments;
  fVar174 = (pGVar19->time_range).lower;
  fVar84 = ((*(float *)(ray + k * 4 + 0x70) - fVar174) / ((pGVar19->time_range).upper - fVar174)) *
           local_548;
  fVar174 = floorf(fVar84);
  if (local_548 + -1.0 <= fVar174) {
    fVar174 = local_548 + -1.0;
  }
  fVar122 = 0.0;
  if (0.0 <= fVar174) {
    fVar122 = fVar174;
  }
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)fVar122 * 0x38;
  lVar22 = *(long *)(_Var20 + 0x10 + lVar73);
  lVar65 = *(long *)(_Var20 + 0x38 + lVar73);
  lVar21 = *(long *)(_Var20 + 0x48 + lVar73);
  pfVar1 = (float *)(lVar65 + uVar77 * lVar21);
  pfVar2 = (float *)(lVar65 + (uVar77 + 1) * lVar21);
  pfVar3 = (float *)(lVar65 + (uVar77 + 2) * lVar21);
  fVar84 = fVar84 - fVar122;
  fVar175 = 1.0 - fVar84;
  pfVar4 = (float *)(lVar65 + lVar21 * (uVar77 + 3));
  pRVar71 = *(RTCIntersectArguments **)(_Var20 + lVar73);
  lVar65 = lVar22 * (uVar77 + 3);
  ppSVar5 = (Scene **)((long)&pRVar71->flags + lVar22 * uVar77);
  ppSVar6 = (Scene **)((long)&pRVar71->flags + lVar22 * (uVar77 + 1));
  ppSVar7 = (Scene **)((long)&pRVar71->flags + lVar22 * (uVar77 + 2));
  local_408 = *(float *)ppSVar5 * fVar175 + *pfVar1 * fVar84;
  local_158 = *(float *)((long)ppSVar5 + 4) * fVar175 + pfVar1[1] * fVar84;
  fStack_400 = *(float *)(ppSVar5 + 1) * fVar175 + pfVar1[2] * fVar84;
  local_418 = *(float *)ppSVar6 * fVar175 + *pfVar2 * fVar84;
  fStack_414 = *(float *)((long)ppSVar6 + 4) * fVar175 + pfVar2[1] * fVar84;
  fStack_410 = *(float *)(ppSVar6 + 1) * fVar175 + pfVar2[2] * fVar84;
  fVar194 = *(float *)ppSVar7 * fVar175 + *pfVar3 * fVar84;
  local_168 = *(float *)((long)ppSVar7 + 4) * fVar175 + pfVar3[1] * fVar84;
  local_178 = *(float *)(ppSVar7 + 1) * fVar175 + pfVar3[2] * fVar84;
  ppSVar8 = (Scene **)((long)&pRVar71->flags + lVar65);
  local_548 = fVar175 * *(float *)ppSVar8 + fVar84 * *pfVar4;
  fStack_544 = fVar175 * *(float *)((long)ppSVar8 + 4) + fVar84 * pfVar4[1];
  fStack_540 = fVar175 * *(float *)(ppSVar8 + 1) + fVar84 * pfVar4[2];
  fVar174 = *(float *)(ray + k * 4 + 0x40);
  fVar122 = *(float *)(ray + k * 4 + 0x50);
  fVar124 = *(float *)(ray + k * 4 + 0x60);
  fVar123 = fVar122 * fVar122;
  fVar160 = fVar124 * fVar124;
  fVar161 = fVar123 + fVar174 * fVar174 + fVar160;
  auVar104._0_8_ = CONCAT44(fVar123 + fVar123 + 0.0,fVar161);
  auVar104._8_4_ = fVar123 + fVar160 + fVar160;
  auVar104._12_4_ = fVar123 + 0.0 + 0.0;
  auVar218._8_4_ = auVar104._8_4_;
  auVar218._0_8_ = auVar104._0_8_;
  auVar218._12_4_ = auVar104._12_4_;
  auVar85 = rcpss(auVar218,auVar104);
  local_568 = (2.0 - auVar85._0_4_ * fVar161) * auVar85._0_4_ *
              (((fStack_400 + fStack_410 + local_178 + fStack_540) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * fVar124 +
              ((local_158 + fStack_414 + local_168 + fStack_544) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * fVar122 +
              ((local_408 + local_418 + fVar194 + local_548) * 0.25 - *(float *)(ray + k * 4)) *
              fVar174);
  fVar123 = fVar174 * local_568 + *(float *)(ray + k * 4);
  fVar162 = fVar122 * local_568 + *(float *)(ray + k * 4 + 0x10);
  fVar173 = fVar124 * local_568 + *(float *)(ray + k * 4 + 0x20);
  local_408 = local_408 - fVar123;
  local_158 = local_158 - fVar162;
  fStack_400 = fStack_400 - fVar173;
  fStack_3fc = (*(float *)((long)ppSVar5 + 0xc) * fVar175 + pfVar1[3] * fVar84) - 0.0;
  fVar194 = fVar194 - fVar123;
  local_168 = local_168 - fVar162;
  local_178 = local_178 - fVar173;
  fStack_41c = (*(float *)((long)ppSVar7 + 0xc) * fVar175 + pfVar3[3] * fVar84) - 0.0;
  local_418 = local_418 - fVar123;
  fStack_414 = fStack_414 - fVar162;
  fStack_410 = fStack_410 - fVar173;
  fVar193 = (*(float *)((long)ppSVar6 + 0xc) * fVar175 + pfVar2[3] * fVar84) - 0.0;
  local_548 = local_548 - fVar123;
  fStack_544 = fStack_544 - fVar162;
  fStack_540 = fStack_540 - fVar173;
  fStack_53c = (fVar175 * *(float *)((long)ppSVar8 + 0xc) + fVar84 * pfVar4[3]) - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fVar84 = fVar122 * fVar122;
  fStack_404 = local_158;
  fStack_13c = fVar174 * fVar174;
  local_148 = fStack_13c + fVar84 + fVar160;
  fStack_144 = fStack_13c + fVar84 + fVar160;
  fStack_140 = fStack_13c + fVar84 + fVar160;
  fStack_13c = fStack_13c + fVar84 + fVar160;
  fStack_40c = fVar193;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_428 = fVar194;
  fStack_424 = local_168;
  fStack_420 = local_178;
  local_358 = fStack_41c;
  fStack_354 = fStack_41c;
  fStack_350 = fStack_41c;
  fStack_34c = fStack_41c;
  local_188 = local_548;
  fStack_184 = local_548;
  fStack_180 = local_548;
  fStack_17c = local_548;
  local_198 = fStack_544;
  fStack_194 = fStack_544;
  fStack_190 = fStack_544;
  fStack_18c = fStack_544;
  local_1a8 = fStack_540;
  fStack_1a4 = fStack_540;
  fStack_1a0 = fStack_540;
  fStack_19c = fStack_540;
  local_1b8 = fStack_53c;
  fStack_1b4 = fStack_53c;
  fStack_1b0 = fStack_53c;
  fStack_1ac = fStack_53c;
  fVar84 = *(float *)(ray + k * 4 + 0x40);
  local_438 = fVar122;
  fStack_434 = fVar122;
  fStack_430 = fVar122;
  fStack_42c = fVar122;
  local_368 = ABS(local_148);
  fStack_364 = ABS(fStack_144);
  fStack_360 = ABS(fStack_140);
  fStack_35c = ABS(fStack_13c);
  fVar123 = *(float *)(ray + k * 4 + 0x30);
  local_3c8 = ZEXT416((uint)local_568);
  local_208 = fVar123 - local_568;
  fStack_204 = local_208;
  fStack_200 = local_208;
  fStack_1fc = local_208;
  local_470 = (ulong)uVar79;
  local_378 = uVar79;
  uStack_374 = uVar79;
  uStack_370 = uVar79;
  uStack_36c = uVar79;
  local_388 = uVar80;
  uStack_384 = uVar80;
  uStack_380 = uVar80;
  uStack_37c = uVar80;
  uVar77 = 0;
  bVar74 = false;
  fVar160 = 1.4013e-45;
  local_1f8 = 0.0;
  fStack_1f4 = 1.0;
  local_248 = local_408;
  fStack_244 = local_408;
  fStack_240 = local_408;
  fStack_23c = local_408;
  local_258 = fStack_400;
  fStack_254 = fStack_400;
  fStack_250 = fStack_400;
  fStack_24c = fStack_400;
  local_448 = fStack_3fc;
  fStack_444 = fStack_3fc;
  fStack_440 = fStack_3fc;
  fStack_43c = fStack_3fc;
  local_458 = local_418;
  fStack_454 = local_418;
  fStack_450 = local_418;
  fStack_44c = local_418;
  local_268 = fStack_414;
  fStack_264 = fStack_414;
  fStack_260 = fStack_414;
  fStack_25c = fStack_414;
  local_468 = fStack_410;
  fStack_464 = fStack_410;
  fStack_460 = fStack_410;
  fStack_45c = fStack_410;
  fStack_564 = local_568;
  fStack_560 = local_568;
  fStack_55c = local_568;
  do {
    uVar63 = SUB84(pRVar71,0);
    iVar76 = (int)uVar77;
    fVar253 = fStack_1f4 - local_1f8;
    uStack_1f0 = 0;
    uStack_1ec = 0;
    local_578._4_4_ = local_1f8;
    local_578._0_4_ = local_1f8;
    fStack_570 = local_1f8;
    fStack_56c = local_1f8;
    fVar199 = fVar253 * 0.0 + local_1f8;
    fVar200 = fVar253 * 0.33333334 + local_1f8;
    fVar201 = fVar253 * 0.6666667 + local_1f8;
    fVar227 = fVar253 * 1.0 + local_1f8;
    fVar228 = 1.0 - fVar199;
    fVar242 = 1.0 - fVar200;
    fVar243 = 1.0 - fVar201;
    fVar244 = 1.0 - fVar227;
    fVar291 = local_458 * fVar228 + fVar194 * fVar199;
    fVar306 = fStack_454 * fVar242 + fVar194 * fVar200;
    fVar307 = fStack_450 * fVar243 + fVar194 * fVar201;
    fVar309 = fStack_44c * fVar244 + fVar194 * fVar227;
    fVar316 = local_268 * fVar228 + local_168 * fVar199;
    fVar318 = fStack_264 * fVar242 + fStack_164 * fVar200;
    fVar320 = fStack_260 * fVar243 + fStack_160 * fVar201;
    fVar282 = fStack_25c * fVar244 + fStack_15c * fVar227;
    fVar284 = local_468 * fVar228 + local_178 * fVar199;
    fVar292 = fStack_464 * fVar242 + fStack_174 * fVar200;
    fVar294 = fStack_460 * fVar243 + fStack_170 * fVar201;
    fVar296 = fStack_45c * fVar244 + fStack_16c * fVar227;
    fVar229 = fVar193 * fVar228 + local_358 * fVar199;
    fVar293 = fVar193 * fVar242 + fStack_354 * fVar200;
    fVar295 = fVar193 * fVar243 + fStack_350 * fVar201;
    fVar297 = fVar193 * fVar244 + fStack_34c * fVar227;
    fVar162 = (local_248 * fVar228 + local_458 * fVar199) * fVar228 + fVar199 * fVar291;
    fVar173 = (fStack_244 * fVar242 + fStack_454 * fVar200) * fVar242 + fVar200 * fVar306;
    fVar175 = (fStack_240 * fVar243 + fStack_450 * fVar201) * fVar243 + fVar201 * fVar307;
    fVar195 = (fStack_23c * fVar244 + fStack_44c * fVar227) * fVar244 + fVar227 * fVar309;
    fVar254 = (local_158 * fVar228 + local_268 * fVar199) * fVar228 + fVar199 * fVar316;
    fVar262 = (fStack_154 * fVar242 + fStack_264 * fVar200) * fVar242 + fVar200 * fVar318;
    fVar273 = (fStack_150 * fVar243 + fStack_260 * fVar201) * fVar243 + fVar201 * fVar320;
    fVar274 = (fStack_14c * fVar244 + fStack_25c * fVar227) * fVar244 + fVar227 * fVar282;
    fVar308 = (local_258 * fVar228 + local_468 * fVar199) * fVar228 + fVar199 * fVar284;
    fVar255 = (fStack_254 * fVar242 + fStack_464 * fVar200) * fVar242 + fVar200 * fVar292;
    fVar260 = (fStack_250 * fVar243 + fStack_460 * fVar201) * fVar243 + fVar201 * fVar294;
    fVar261 = (fStack_24c * fVar244 + fStack_45c * fVar227) * fVar244 + fVar227 * fVar296;
    fVar275 = (local_448 * fVar228 + fVar193 * fVar199) * fVar228 + fVar199 * fVar229;
    fVar280 = (fStack_444 * fVar242 + fVar193 * fVar200) * fVar242 + fVar200 * fVar293;
    fVar281 = (fStack_440 * fVar243 + fVar193 * fVar201) * fVar243 + fVar201 * fVar295;
    fVar283 = (fStack_43c * fVar244 + fVar193 * fVar227) * fVar244 + fVar227 * fVar297;
    fVar305 = fVar291 * fVar228 + (fVar194 * fVar228 + local_188 * fVar199) * fVar199;
    fVar306 = fVar306 * fVar242 + (fVar194 * fVar242 + fStack_184 * fVar200) * fVar200;
    fVar307 = fVar307 * fVar243 + (fVar194 * fVar243 + fStack_180 * fVar201) * fVar201;
    fVar309 = fVar309 * fVar244 + (fVar194 * fVar244 + fStack_17c * fVar227) * fVar227;
    fVar316 = fVar316 * fVar228 + (local_168 * fVar228 + local_198 * fVar199) * fVar199;
    fVar318 = fVar318 * fVar242 + (fStack_164 * fVar242 + fStack_194 * fVar200) * fVar200;
    fVar320 = fVar320 * fVar243 + (fStack_160 * fVar243 + fStack_190 * fVar201) * fVar201;
    fVar282 = fVar282 * fVar244 + (fStack_15c * fVar244 + fStack_18c * fVar227) * fVar227;
    fVar284 = fVar284 * fVar228 + (local_178 * fVar228 + local_1a8 * fVar199) * fVar199;
    fVar292 = fVar292 * fVar242 + (fStack_174 * fVar242 + fStack_1a4 * fVar200) * fVar200;
    fVar294 = fVar294 * fVar243 + (fStack_170 * fVar243 + fStack_1a0 * fVar201) * fVar201;
    fVar296 = fVar296 * fVar244 + (fStack_16c * fVar244 + fStack_19c * fVar227) * fVar227;
    fVar291 = fVar229 * fVar228 + (local_358 * fVar228 + local_1b8 * fVar199) * fVar199;
    fVar293 = fVar293 * fVar242 + (fStack_354 * fVar242 + fStack_1b4 * fVar200) * fVar200;
    fVar295 = fVar295 * fVar243 + (fStack_350 * fVar243 + fStack_1b0 * fVar201) * fVar201;
    fVar297 = fVar297 * fVar244 + (fStack_34c * fVar244 + fStack_1ac * fVar227) * fVar227;
    fVar310 = fVar228 * fVar162 + fVar199 * fVar305;
    fVar317 = fVar242 * fVar173 + fVar200 * fVar306;
    fVar319 = fVar243 * fVar175 + fVar201 * fVar307;
    fVar321 = fVar244 * fVar195 + fVar227 * fVar309;
    fVar322 = fVar228 * fVar254 + fVar199 * fVar316;
    fVar326 = fVar242 * fVar262 + fVar200 * fVar318;
    fVar327 = fVar243 * fVar273 + fVar201 * fVar320;
    fVar328 = fVar244 * fVar274 + fVar227 * fVar282;
    local_558 = fVar228 * fVar308 + fVar199 * fVar284;
    fStack_554 = fVar242 * fVar255 + fVar200 * fVar292;
    fStack_550 = fVar243 * fVar260 + fVar201 * fVar294;
    fStack_54c = fVar244 * fVar261 + fVar227 * fVar296;
    fVar229 = fVar253 * 0.11111111;
    fVar199 = fVar228 * fVar275 + fVar199 * fVar291;
    fVar200 = fVar242 * fVar280 + fVar200 * fVar293;
    auVar165._0_8_ = CONCAT44(fVar200,fVar199);
    auVar165._8_4_ = fVar243 * fVar281 + fVar201 * fVar295;
    auVar165._12_4_ = fVar244 * fVar283 + fVar227 * fVar297;
    fVar305 = (fVar305 - fVar162) * 3.0 * fVar229;
    local_4e8._0_4_ = (fVar306 - fVar173) * 3.0 * fVar229;
    local_4e8._4_4_ = (fVar307 - fVar175) * 3.0 * fVar229;
    fStack_4e0 = (fVar309 - fVar195) * 3.0 * fVar229;
    fVar306 = (fVar316 - fVar254) * 3.0 * fVar229;
    local_4c8 = (fVar318 - fVar262) * 3.0 * fVar229;
    fStack_4c4 = (fVar320 - fVar273) * 3.0 * fVar229;
    fStack_4c0 = (fVar282 - fVar274) * 3.0 * fVar229;
    local_488._0_4_ = (fVar284 - fVar308) * 3.0 * fVar229;
    local_488._4_4_ = (fVar292 - fVar255) * 3.0 * fVar229;
    fStack_480 = (fVar294 - fVar260) * 3.0 * fVar229;
    fStack_47c = (fVar296 - fVar261) * 3.0 * fVar229;
    fVar162 = fVar229 * (fVar293 - fVar280) * 3.0;
    fVar173 = fVar229 * (fVar295 - fVar281) * 3.0;
    fVar175 = fVar229 * (fVar297 - fVar283) * 3.0;
    local_498._4_4_ = fVar319;
    local_498._0_4_ = fVar317;
    fStack_490 = fVar321;
    fStack_48c = 0.0;
    local_4a8._4_4_ = fVar327;
    local_4a8._0_4_ = fVar326;
    fStack_4a0 = fVar328;
    fStack_49c = 0.0;
    local_4b8._4_4_ = fStack_550;
    local_4b8._0_4_ = fStack_554;
    local_4b8._8_4_ = fStack_54c;
    local_4b8._12_4_ = 0;
    auVar137._4_4_ = auVar165._8_4_;
    auVar137._0_4_ = fVar200;
    auVar137._8_4_ = auVar165._12_4_;
    auVar137._12_4_ = 0;
    local_658._4_4_ = fVar200 + fVar162;
    local_658._0_4_ = fVar199 + fVar229 * (fVar291 - fVar275) * 3.0;
    fStack_650 = auVar165._8_4_ + fVar173;
    fStack_64c = auVar165._12_4_ + fVar175;
    auVar138._0_8_ = CONCAT44(auVar165._8_4_ - fVar173,fVar200 - fVar162);
    auVar138._8_4_ = auVar165._12_4_ - fVar175;
    auVar138._12_4_ = 0;
    local_3d8._0_4_ = fVar326 - fVar322;
    local_3d8._4_4_ = fVar327 - fVar326;
    fStack_3d0 = fVar328 - fVar327;
    fStack_3cc = 0.0 - fVar328;
    local_3e8._0_4_ = fStack_554 - local_558;
    local_3e8._4_4_ = fStack_550 - fStack_554;
    fStack_3e0 = fStack_54c - fStack_550;
    fStack_3dc = 0.0 - fStack_54c;
    fVar228 = fVar306 * (float)local_3e8._0_4_ - (float)local_488._0_4_ * (float)local_3d8._0_4_;
    fVar229 = local_4c8 * (float)local_3e8._4_4_ - (float)local_488._4_4_ * (float)local_3d8._4_4_;
    fVar242 = fStack_4c4 * fStack_3e0 - fStack_480 * fStack_3d0;
    fVar243 = fStack_4c0 * fStack_3dc - fStack_47c * fStack_3cc;
    local_3f8 = fVar317 - fVar310;
    fStack_3f4 = fVar319 - fVar317;
    fStack_3f0 = fVar321 - fVar319;
    fStack_3ec = 0.0 - fVar321;
    fVar199 = (float)local_488._0_4_ * local_3f8 - fVar305 * (float)local_3e8._0_4_;
    fVar200 = (float)local_488._4_4_ * fStack_3f4 - (float)local_4e8._0_4_ * (float)local_3e8._4_4_;
    fVar201 = fStack_480 * fStack_3f0 - (float)local_4e8._4_4_ * fStack_3e0;
    fVar227 = fStack_47c * fStack_3ec - fStack_4e0 * fStack_3dc;
    fVar244 = fVar305 * (float)local_3d8._0_4_ - fVar306 * local_3f8;
    fVar254 = (float)local_4e8._0_4_ * (float)local_3d8._4_4_ - local_4c8 * fStack_3f4;
    fVar262 = (float)local_4e8._4_4_ * fStack_3d0 - fStack_4c4 * fStack_3f0;
    fVar273 = fStack_4e0 * fStack_3cc - fStack_4c0 * fStack_3ec;
    auVar105._0_4_ = (float)local_3e8._0_4_ * (float)local_3e8._0_4_;
    auVar105._4_4_ = (float)local_3e8._4_4_ * (float)local_3e8._4_4_;
    auVar105._8_4_ = fStack_3e0 * fStack_3e0;
    auVar105._12_4_ = fStack_3dc * fStack_3dc;
    auVar250._0_4_ =
         local_3f8 * local_3f8 + (float)local_3d8._0_4_ * (float)local_3d8._0_4_ + auVar105._0_4_;
    auVar250._4_4_ =
         fStack_3f4 * fStack_3f4 + (float)local_3d8._4_4_ * (float)local_3d8._4_4_ + auVar105._4_4_;
    auVar250._8_4_ = fStack_3f0 * fStack_3f0 + fStack_3d0 * fStack_3d0 + auVar105._8_4_;
    auVar250._12_4_ = fStack_3ec * fStack_3ec + fStack_3cc * fStack_3cc + auVar105._12_4_;
    auVar85 = rcpps(auVar105,auVar250);
    fVar162 = auVar85._0_4_;
    fVar173 = auVar85._4_4_;
    fVar175 = auVar85._8_4_;
    fVar195 = auVar85._12_4_;
    fVar162 = (1.0 - fVar162 * auVar250._0_4_) * fVar162 + fVar162;
    fVar173 = (1.0 - fVar173 * auVar250._4_4_) * fVar173 + fVar173;
    fVar175 = (1.0 - fVar175 * auVar250._8_4_) * fVar175 + fVar175;
    fVar195 = (1.0 - fVar195 * auVar250._12_4_) * fVar195 + fVar195;
    fVar274 = (float)local_3e8._0_4_ * local_4c8 - (float)local_3d8._0_4_ * (float)local_488._4_4_;
    fVar308 = (float)local_3e8._4_4_ * fStack_4c4 - (float)local_3d8._4_4_ * fStack_480;
    fVar255 = fStack_3e0 * fStack_4c0 - fStack_3d0 * fStack_47c;
    fVar260 = fStack_3dc * 0.0 - fStack_3cc * 0.0;
    local_4d8 = (float)local_488._4_4_;
    fStack_4d4 = fStack_480;
    fStack_4d0 = fStack_47c;
    fStack_4cc = 0.0;
    fVar261 = local_3f8 * (float)local_488._4_4_ - (float)local_3e8._0_4_ * (float)local_4e8._0_4_;
    fVar275 = fStack_3f4 * fStack_480 - (float)local_3e8._4_4_ * (float)local_4e8._4_4_;
    fVar280 = fStack_3f0 * fStack_47c - fStack_3e0 * fStack_4e0;
    fVar281 = fStack_3ec * 0.0 - fStack_3dc * 0.0;
    fStack_4bc = 0.0;
    uStack_4dc = 0;
    fVar283 = (float)local_3d8._0_4_ * (float)local_4e8._0_4_ - local_3f8 * local_4c8;
    fVar291 = (float)local_3d8._4_4_ * (float)local_4e8._4_4_ - fStack_3f4 * fStack_4c4;
    fVar293 = fStack_3d0 * fStack_4e0 - fStack_3f0 * fStack_4c0;
    fVar295 = fStack_3cc * 0.0 - fStack_3ec * 0.0;
    auVar311._0_4_ = fVar261 * fVar261 + fVar283 * fVar283;
    auVar311._4_4_ = fVar275 * fVar275 + fVar291 * fVar291;
    auVar311._8_4_ = fVar280 * fVar280 + fVar293 * fVar293;
    auVar311._12_4_ = fVar281 * fVar281 + fVar295 * fVar295;
    auVar231._0_4_ = (fVar228 * fVar228 + fVar199 * fVar199 + fVar244 * fVar244) * fVar162;
    auVar231._4_4_ = (fVar229 * fVar229 + fVar200 * fVar200 + fVar254 * fVar254) * fVar173;
    auVar231._8_4_ = (fVar242 * fVar242 + fVar201 * fVar201 + fVar262 * fVar262) * fVar175;
    auVar231._12_4_ = (fVar243 * fVar243 + fVar227 * fVar227 + fVar273 * fVar273) * fVar195;
    auVar256._0_4_ = (fVar274 * fVar274 + auVar311._0_4_) * fVar162;
    auVar256._4_4_ = (fVar308 * fVar308 + auVar311._4_4_) * fVar173;
    auVar256._8_4_ = (fVar255 * fVar255 + auVar311._8_4_) * fVar175;
    auVar256._12_4_ = (fVar260 * fVar260 + auVar311._12_4_) * fVar195;
    auVar232 = maxps(auVar231,auVar256);
    auVar219._8_4_ = auVar165._8_4_;
    auVar219._0_8_ = auVar165._0_8_;
    auVar219._12_4_ = auVar165._12_4_;
    auVar85 = maxps(auVar219,_local_658);
    auVar257._8_4_ = auVar138._8_4_;
    auVar257._0_8_ = auVar138._0_8_;
    auVar257._12_4_ = 0;
    auVar164 = maxps(auVar257,auVar137);
    auVar267 = maxps(auVar85,auVar164);
    auVar164 = minps(auVar165,_local_658);
    auVar85 = minps(auVar138,auVar137);
    auVar164 = minps(auVar164,auVar85);
    auVar85 = sqrtps(auVar85,auVar232);
    auVar232 = rsqrtps(auVar311,auVar250);
    fVar162 = auVar232._0_4_;
    fVar175 = auVar232._4_4_;
    fVar199 = auVar232._8_4_;
    fVar201 = auVar232._12_4_;
    fVar173 = fVar162 * fVar162 * auVar250._0_4_ * -0.5 * fVar162 + fVar162 * 1.5;
    fVar195 = fVar175 * fVar175 * auVar250._4_4_ * -0.5 * fVar175 + fVar175 * 1.5;
    fVar200 = fVar199 * fVar199 * auVar250._8_4_ * -0.5 * fVar199 + fVar199 * 1.5;
    fVar227 = fVar201 * fVar201 * auVar250._12_4_ * -0.5 * fVar201 + fVar201 * 1.5;
    fVar261 = 0.0 - fVar322;
    fVar280 = 0.0 - fVar326;
    fVar283 = 0.0 - fVar327;
    fVar293 = 0.0 - fVar328;
    local_4f8 = 0.0 - local_558;
    fStack_4f4 = 0.0 - fStack_554;
    fStack_4f0 = 0.0 - fStack_550;
    fStack_4ec = 0.0 - fStack_54c;
    fVar274 = 0.0 - fVar310;
    fVar308 = 0.0 - fVar317;
    fVar255 = 0.0 - fVar319;
    fVar260 = 0.0 - fVar321;
    auVar26._4_4_ = fVar84;
    auVar26._0_4_ = fVar84;
    auVar26._8_4_ = fVar84;
    auVar26._12_4_ = fVar84;
    fVar228 = fVar84 * local_3f8 * fVar173 +
              local_438 * (float)local_3d8._0_4_ * fVar173 +
              fVar124 * (float)local_3e8._0_4_ * fVar173;
    fVar242 = fVar84 * fStack_3f4 * fVar195 +
              fStack_434 * (float)local_3d8._4_4_ * fVar195 +
              fVar124 * (float)local_3e8._4_4_ * fVar195;
    fVar244 = fVar84 * fStack_3f0 * fVar200 +
              fStack_430 * fStack_3d0 * fVar200 + fVar124 * fStack_3e0 * fVar200;
    fVar262 = fVar84 * fStack_3ec * fVar227 +
              fStack_42c * fStack_3cc * fVar227 + fVar124 * fStack_3dc * fVar227;
    auVar233._8_4_ = fVar244;
    auVar233._0_8_ = CONCAT44(fVar242,fVar228);
    auVar233._12_4_ = fVar262;
    local_1d8 = local_3f8 * fVar173 * fVar274 +
                (float)local_3d8._0_4_ * fVar173 * fVar261 +
                (float)local_3e8._0_4_ * fVar173 * local_4f8;
    fStack_1d4 = fStack_3f4 * fVar195 * fVar308 +
                 (float)local_3d8._4_4_ * fVar195 * fVar280 +
                 (float)local_3e8._4_4_ * fVar195 * fStack_4f4;
    fStack_1d0 = fStack_3f0 * fVar200 * fVar255 +
                 fStack_3d0 * fVar200 * fVar283 + fStack_3e0 * fVar200 * fStack_4f0;
    fStack_1cc = fStack_3ec * fVar227 * fVar260 +
                 fStack_3cc * fVar227 * fVar293 + fStack_3dc * fVar227 * fStack_4ec;
    local_1e8 = (fVar84 * fVar274 + local_438 * fVar261 + fVar124 * local_4f8) - fVar228 * local_1d8
    ;
    fStack_1e4 = (fVar84 * fVar308 + fStack_434 * fVar280 + fVar124 * fStack_4f4) -
                 fVar242 * fStack_1d4;
    fStack_1e0 = (fVar84 * fVar255 + fStack_430 * fVar283 + fVar124 * fStack_4f0) -
                 fVar244 * fStack_1d0;
    fStack_1dc = (fVar84 * fVar260 + fStack_42c * fVar293 + fVar124 * fStack_4ec) -
                 fVar262 * fStack_1cc;
    fVar162 = (fVar274 * fVar274 + fVar261 * fVar261 + local_4f8 * local_4f8) -
              local_1d8 * local_1d8;
    fVar175 = (fVar308 * fVar308 + fVar280 * fVar280 + fStack_4f4 * fStack_4f4) -
              fStack_1d4 * fStack_1d4;
    fVar199 = (fVar255 * fVar255 + fVar283 * fVar283 + fStack_4f0 * fStack_4f0) -
              fStack_1d0 * fStack_1d0;
    fVar201 = (fVar260 * fVar260 + fVar293 * fVar293 + fStack_4ec * fStack_4ec) -
              fStack_1cc * fStack_1cc;
    fVar229 = (auVar267._0_4_ + auVar85._0_4_) * 1.0000002;
    fVar243 = (auVar267._4_4_ + auVar85._4_4_) * 1.0000002;
    fVar254 = (auVar267._8_4_ + auVar85._8_4_) * 1.0000002;
    fVar273 = (auVar267._12_4_ + auVar85._12_4_) * 1.0000002;
    fVar275 = fVar162 - fVar229 * fVar229;
    fVar281 = fVar175 - fVar243 * fVar243;
    fVar291 = fVar199 - fVar254 * fVar254;
    fVar295 = fVar201 - fVar273 * fVar273;
    local_1c8 = fVar228 * fVar228;
    fStack_1c4 = fVar242 * fVar242;
    fStack_1c0 = fVar244 * fVar244;
    fStack_1bc = fVar262 * fVar262;
    fVar229 = local_148 - local_1c8;
    fVar243 = fStack_144 - fStack_1c4;
    fVar254 = fStack_140 - fStack_1c0;
    fVar273 = fStack_13c - fStack_1bc;
    local_1e8 = local_1e8 + local_1e8;
    fStack_1e4 = fStack_1e4 + fStack_1e4;
    fStack_1e0 = fStack_1e0 + fStack_1e0;
    fStack_1dc = fStack_1dc + fStack_1dc;
    local_588._0_4_ = fVar229 * 4.0;
    local_588._4_4_ = fVar243 * 4.0;
    fStack_580 = fVar254 * 4.0;
    fStack_57c = fVar273 * 4.0;
    auVar220._0_4_ = local_1e8 * local_1e8 - (float)local_588._0_4_ * fVar275;
    auVar220._4_4_ = fStack_1e4 * fStack_1e4 - (float)local_588._4_4_ * fVar281;
    auVar220._8_4_ = fStack_1e0 * fStack_1e0 - fStack_580 * fVar291;
    auVar220._12_4_ = fStack_1dc * fStack_1dc - fStack_57c * fVar295;
    local_508._4_4_ = (auVar164._4_4_ - auVar85._4_4_) * 0.99999976;
    local_508._0_4_ = (auVar164._0_4_ - auVar85._0_4_) * 0.99999976;
    fStack_500 = (auVar164._8_4_ - auVar85._8_4_) * 0.99999976;
    fStack_4fc = (auVar164._12_4_ - auVar85._12_4_) * 0.99999976;
    auVar312._4_4_ = -(uint)(0.0 <= auVar220._4_4_);
    auVar312._0_4_ = -(uint)(0.0 <= auVar220._0_4_);
    auVar312._8_4_ = -(uint)(0.0 <= auVar220._8_4_);
    auVar312._12_4_ = -(uint)(0.0 <= auVar220._12_4_);
    uVar70 = (undefined4)((ulong)lVar65 >> 0x20);
    iVar62 = movmskps((int)lVar65,auVar312);
    if (iVar62 == 0) {
      iVar62 = 0;
      auVar140 = _DAT_01f7a9f0;
      auVar258 = _DAT_01f7aa00;
    }
    else {
      auVar164 = sqrtps(auVar26,auVar220);
      bVar78 = 0.0 <= auVar220._0_4_;
      uVar79 = -(uint)bVar78;
      bVar23 = 0.0 <= auVar220._4_4_;
      uVar80 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar220._8_4_;
      uVar81 = -(uint)bVar24;
      bVar25 = 0.0 <= auVar220._12_4_;
      uVar82 = -(uint)bVar25;
      auVar139._0_4_ = fVar229 + fVar229;
      auVar139._4_4_ = fVar243 + fVar243;
      auVar139._8_4_ = fVar254 + fVar254;
      auVar139._12_4_ = fVar273 + fVar273;
      auVar85 = rcpps(auVar233,auVar139);
      fVar297 = auVar85._0_4_;
      fVar307 = auVar85._4_4_;
      fVar309 = auVar85._8_4_;
      fVar316 = auVar85._12_4_;
      fVar297 = (1.0 - auVar139._0_4_ * fVar297) * fVar297 + fVar297;
      fVar307 = (1.0 - auVar139._4_4_ * fVar307) * fVar307 + fVar307;
      fVar309 = (1.0 - auVar139._8_4_ * fVar309) * fVar309 + fVar309;
      fVar316 = (1.0 - auVar139._12_4_ * fVar316) * fVar316 + fVar316;
      fVar318 = (-local_1e8 - auVar164._0_4_) * fVar297;
      fVar320 = (-fStack_1e4 - auVar164._4_4_) * fVar307;
      fVar282 = (-fStack_1e0 - auVar164._8_4_) * fVar309;
      fVar284 = (-fStack_1dc - auVar164._12_4_) * fVar316;
      fVar297 = (auVar164._0_4_ - local_1e8) * fVar297;
      fVar307 = (auVar164._4_4_ - fStack_1e4) * fVar307;
      fVar309 = (auVar164._8_4_ - fStack_1e0) * fVar309;
      fVar316 = (auVar164._12_4_ - fStack_1dc) * fVar316;
      local_238 = (fVar228 * fVar318 + local_1d8) * fVar173;
      fStack_234 = (fVar242 * fVar320 + fStack_1d4) * fVar195;
      fStack_230 = (fVar244 * fVar282 + fStack_1d0) * fVar200;
      fStack_22c = (fVar262 * fVar284 + fStack_1cc) * fVar227;
      local_228 = (fVar228 * fVar297 + local_1d8) * fVar173;
      fStack_224 = (fVar242 * fVar307 + fStack_1d4) * fVar195;
      fStack_220 = (fVar244 * fVar309 + fStack_1d0) * fVar200;
      fStack_21c = (fVar262 * fVar316 + fStack_1cc) * fVar227;
      auVar303._0_4_ = (uint)fVar318 & uVar79;
      auVar303._4_4_ = (uint)fVar320 & uVar80;
      auVar303._8_4_ = (uint)fVar282 & uVar81;
      auVar303._12_4_ = (uint)fVar284 & uVar82;
      auVar140._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
      auVar140._8_4_ = ~uVar81 & 0x7f800000;
      auVar140._12_4_ = ~uVar82 & 0x7f800000;
      auVar140 = auVar140 | auVar303;
      auVar268._0_4_ = (uint)fVar297 & uVar79;
      auVar268._4_4_ = (uint)fVar307 & uVar80;
      auVar268._8_4_ = (uint)fVar309 & uVar81;
      auVar268._12_4_ = (uint)fVar316 & uVar82;
      auVar258._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
      auVar258._8_4_ = ~uVar81 & 0xff800000;
      auVar258._12_4_ = ~uVar82 & 0xff800000;
      auVar258 = auVar258 | auVar268;
      auVar181._0_8_ = CONCAT44(fStack_1c4,local_1c8) & 0x7fffffff7fffffff;
      auVar181._8_4_ = ABS(fStack_1c0);
      auVar181._12_4_ = ABS(fStack_1bc);
      auVar35._4_4_ = fStack_364;
      auVar35._0_4_ = local_368;
      auVar35._8_4_ = fStack_360;
      auVar35._12_4_ = fStack_35c;
      auVar85 = maxps(auVar35,auVar181);
      fVar228 = auVar85._0_4_ * 1.9073486e-06;
      fVar242 = auVar85._4_4_ * 1.9073486e-06;
      fVar244 = auVar85._8_4_ * 1.9073486e-06;
      fVar262 = auVar85._12_4_ * 1.9073486e-06;
      auVar323._0_4_ = -(uint)(ABS(fVar229) < fVar228 && bVar78);
      auVar323._4_4_ = -(uint)(ABS(fVar243) < fVar242 && bVar23);
      auVar323._8_4_ = -(uint)(ABS(fVar254) < fVar244 && bVar24);
      auVar323._12_4_ = -(uint)(ABS(fVar273) < fVar262 && bVar25);
      iVar62 = movmskps(iVar62,auVar323);
      if (iVar62 != 0) {
        uVar79 = -(uint)(fVar275 <= 0.0);
        uVar80 = -(uint)(fVar281 <= 0.0);
        uVar81 = -(uint)(fVar291 <= 0.0);
        uVar82 = -(uint)(fVar295 <= 0.0);
        auVar329._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar323._0_4_;
        auVar329._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar323._4_4_;
        auVar329._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar323._8_4_;
        auVar329._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar323._12_4_;
        auVar166._0_4_ = ~auVar323._0_4_ & auVar140._0_4_;
        auVar166._4_4_ = ~auVar323._4_4_ & auVar140._4_4_;
        auVar166._8_4_ = ~auVar323._8_4_ & auVar140._8_4_;
        auVar166._12_4_ = ~auVar323._12_4_ & auVar140._12_4_;
        auVar313._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar323._0_4_;
        auVar313._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar323._4_4_;
        auVar313._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar323._8_4_;
        auVar313._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar323._12_4_;
        auVar324._0_4_ = ~auVar323._0_4_ & auVar258._0_4_;
        auVar324._4_4_ = ~auVar323._4_4_ & auVar258._4_4_;
        auVar324._8_4_ = ~auVar323._8_4_ & auVar258._8_4_;
        auVar324._12_4_ = ~auVar323._12_4_ & auVar258._12_4_;
        auVar312._4_4_ = -(uint)((fVar242 <= ABS(fVar243) || fVar281 <= 0.0) && bVar23);
        auVar312._0_4_ = -(uint)((fVar228 <= ABS(fVar229) || fVar275 <= 0.0) && bVar78);
        auVar312._8_4_ = -(uint)((fVar244 <= ABS(fVar254) || fVar291 <= 0.0) && bVar24);
        auVar312._12_4_ = -(uint)((fVar262 <= ABS(fVar273) || fVar295 <= 0.0) && bVar25);
        auVar140 = auVar166 | auVar329;
        auVar258 = auVar324 | auVar313;
      }
    }
    auVar314._0_4_ = (auVar312._0_4_ << 0x1f) >> 0x1f;
    auVar314._4_4_ = (auVar312._4_4_ << 0x1f) >> 0x1f;
    auVar314._8_4_ = (auVar312._8_4_ << 0x1f) >> 0x1f;
    auVar314._12_4_ = (auVar312._12_4_ << 0x1f) >> 0x1f;
    auVar314 = auVar314 & local_218;
    iVar62 = movmskps(iVar62,auVar314);
    if (iVar62 != 0) {
      _local_288 = auVar233;
      local_278 = fVar229;
      fStack_274 = fVar243;
      fStack_270 = fVar254;
      fStack_26c = fVar273;
      fVar228 = *(float *)(ray + k * 4 + 0x80);
      auVar234._0_4_ = fVar228 - (float)local_3c8._0_4_;
      auVar234._4_4_ = auVar234._0_4_;
      auVar234._8_4_ = auVar234._0_4_;
      auVar234._12_4_ = auVar234._0_4_;
      auVar164 = minps(auVar234,auVar258);
      auVar39._4_4_ = fStack_204;
      auVar39._0_4_ = local_208;
      auVar39._8_4_ = fStack_200;
      auVar39._12_4_ = fStack_1fc;
      auVar267 = maxps(auVar39,auVar140);
      auVar141._0_4_ = fVar306 * local_438 + (float)local_488._0_4_ * fVar124;
      auVar141._4_4_ = local_4c8 * fStack_434 + (float)local_488._4_4_ * fVar124;
      auVar141._8_4_ = fStack_4c4 * fStack_430 + fStack_480 * fVar124;
      auVar141._12_4_ = fStack_4c0 * fStack_42c + fStack_47c * fVar124;
      auVar269._0_4_ = fVar305 * fVar84 + auVar141._0_4_;
      auVar269._4_4_ = (float)local_4e8._0_4_ * fVar84 + auVar141._4_4_;
      auVar269._8_4_ = (float)local_4e8._4_4_ * fVar84 + auVar141._8_4_;
      auVar269._12_4_ = fStack_4e0 * fVar84 + auVar141._12_4_;
      auVar85 = rcpps(auVar141,auVar269);
      fVar242 = auVar85._0_4_;
      fVar244 = auVar85._4_4_;
      fVar262 = auVar85._8_4_;
      fVar275 = auVar85._12_4_;
      fVar242 = ((1.0 - auVar269._0_4_ * fVar242) * fVar242 + fVar242) *
                -(fVar274 * fVar305 + fVar261 * fVar306 + local_4f8 * (float)local_488._0_4_);
      fVar244 = ((1.0 - auVar269._4_4_ * fVar244) * fVar244 + fVar244) *
                -(fVar308 * (float)local_4e8._0_4_ +
                 fVar280 * local_4c8 + fStack_4f4 * (float)local_488._4_4_);
      fVar262 = ((1.0 - auVar269._8_4_ * fVar262) * fVar262 + fVar262) *
                -(fVar255 * (float)local_4e8._4_4_ + fVar283 * fStack_4c4 + fStack_4f0 * fStack_480)
      ;
      fVar274 = ((1.0 - auVar269._12_4_ * fVar275) * fVar275 + fVar275) *
                -(fVar260 * fStack_4e0 + fVar293 * fStack_4c0 + fStack_4ec * fStack_47c);
      uVar79 = -(uint)(auVar269._0_4_ < 0.0 || ABS(auVar269._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar269._4_4_ < 0.0 || ABS(auVar269._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar269._8_4_ < 0.0 || ABS(auVar269._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar269._12_4_ < 0.0 || ABS(auVar269._12_4_) < 1e-18);
      auVar182._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar182._8_4_ = uVar81 & 0xff800000;
      auVar182._12_4_ = uVar82 & 0xff800000;
      auVar142._0_4_ = ~uVar79 & (uint)fVar242;
      auVar142._4_4_ = ~uVar80 & (uint)fVar244;
      auVar142._8_4_ = ~uVar81 & (uint)fVar262;
      auVar142._12_4_ = ~uVar82 & (uint)fVar274;
      auVar267 = maxps(auVar267,auVar142 | auVar182);
      uVar79 = -(uint)(0.0 < auVar269._0_4_ || ABS(auVar269._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar269._4_4_ || ABS(auVar269._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar269._8_4_ || ABS(auVar269._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar269._12_4_ || ABS(auVar269._12_4_) < 1e-18);
      auVar143._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar143._8_4_ = uVar81 & 0x7f800000;
      auVar143._12_4_ = uVar82 & 0x7f800000;
      auVar270._0_4_ = ~uVar79 & (uint)fVar242;
      auVar270._4_4_ = ~uVar80 & (uint)fVar244;
      auVar270._8_4_ = ~uVar81 & (uint)fVar262;
      auVar270._12_4_ = ~uVar82 & (uint)fVar274;
      auVar164 = minps(auVar164,auVar270 | auVar143);
      auVar183._0_4_ = (0.0 - fVar326) * -local_4c8 + (0.0 - fStack_554) * -(float)local_488._4_4_;
      auVar183._4_4_ = (0.0 - fVar327) * -fStack_4c4 + (0.0 - fStack_550) * -fStack_480;
      auVar183._8_4_ = (0.0 - fVar328) * -fStack_4c0 + (0.0 - fStack_54c) * -fStack_47c;
      auVar183._12_4_ = 0x80000000;
      auVar106._0_4_ =
           -(float)local_4e8._0_4_ * fVar84 +
           -local_4c8 * local_438 + -(float)local_488._4_4_ * fVar124;
      auVar106._4_4_ =
           -(float)local_4e8._4_4_ * fVar84 + -fStack_4c4 * fStack_434 + -fStack_480 * fVar124;
      auVar106._8_4_ = -fStack_4e0 * fVar84 + -fStack_4c0 * fStack_430 + -fStack_47c * fVar124;
      auVar106._12_4_ = fVar84 * -0.0 + fStack_42c * -0.0 + fVar124 * -0.0;
      auVar85 = rcpps(auVar183,auVar106);
      fVar242 = auVar85._0_4_;
      fVar244 = auVar85._4_4_;
      fVar262 = auVar85._8_4_;
      fVar274 = auVar85._12_4_;
      fVar242 = (((float)DAT_01f7ba10 - auVar106._0_4_ * fVar242) * fVar242 + fVar242) *
                -((0.0 - fVar317) * -(float)local_4e8._0_4_ + auVar183._0_4_);
      fVar244 = ((DAT_01f7ba10._4_4_ - auVar106._4_4_ * fVar244) * fVar244 + fVar244) *
                -((0.0 - fVar319) * -(float)local_4e8._4_4_ + auVar183._4_4_);
      fVar262 = ((DAT_01f7ba10._8_4_ - auVar106._8_4_ * fVar262) * fVar262 + fVar262) *
                -((0.0 - fVar321) * -fStack_4e0 + auVar183._8_4_);
      fVar274 = ((DAT_01f7ba10._12_4_ - auVar106._12_4_ * fVar274) * fVar274 + fVar274) * 0.0;
      uVar79 = -(uint)(auVar106._0_4_ < 0.0 || ABS(auVar106._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar106._4_4_ < 0.0 || ABS(auVar106._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar106._8_4_ < 0.0 || ABS(auVar106._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar106._12_4_ < 0.0 || ABS(auVar106._12_4_) < 1e-18);
      auVar184._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar184._8_4_ = uVar81 & 0xff800000;
      auVar184._12_4_ = uVar82 & 0xff800000;
      auVar144._0_4_ = ~uVar79 & (uint)fVar242;
      auVar144._4_4_ = ~uVar80 & (uint)fVar244;
      auVar144._8_4_ = ~uVar81 & (uint)fVar262;
      auVar144._12_4_ = ~uVar82 & (uint)fVar274;
      auVar267 = maxps(auVar267,auVar144 | auVar184);
      uVar79 = -(uint)(0.0 < auVar106._0_4_ || ABS(auVar106._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar106._4_4_ || ABS(auVar106._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar106._8_4_ || ABS(auVar106._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar106._12_4_ || ABS(auVar106._12_4_) < 1e-18);
      auVar145._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar145._8_4_ = uVar81 & 0x7f800000;
      auVar145._12_4_ = uVar82 & 0x7f800000;
      auVar107._0_4_ = ~uVar79 & (uint)fVar242;
      auVar107._4_4_ = ~uVar80 & (uint)fVar244;
      auVar107._8_4_ = ~uVar81 & (uint)fVar262;
      auVar107._12_4_ = ~uVar82 & (uint)fVar274;
      auVar85 = minps(auVar164,auVar107 | auVar145);
      fVar274 = auVar267._12_4_;
      fVar242 = auVar267._0_4_;
      fVar244 = auVar267._4_4_;
      fVar262 = auVar267._8_4_;
      auVar325._0_4_ = -(uint)(fVar242 <= auVar85._0_4_) & auVar314._0_4_;
      auVar325._4_4_ = -(uint)(fVar244 <= auVar85._4_4_) & auVar314._4_4_;
      auVar325._8_4_ = -(uint)(fVar262 <= auVar85._8_4_) & auVar314._8_4_;
      auVar325._12_4_ = -(uint)(fVar274 <= auVar85._12_4_) & auVar314._12_4_;
      iVar62 = movmskps(iVar62,auVar325);
      if (iVar62 != 0) {
        auVar164 = maxps(ZEXT816(0),_local_508);
        auVar37._4_4_ = fStack_234;
        auVar37._0_4_ = local_238;
        auVar37._8_4_ = fStack_230;
        auVar37._12_4_ = fStack_22c;
        auVar232 = minps(auVar37,_DAT_01f7ba10);
        auVar196._0_12_ = ZEXT812(0);
        auVar196._12_4_ = 0.0;
        auVar251 = maxps(auVar232,auVar196);
        auVar38._4_4_ = fStack_224;
        auVar38._0_4_ = local_228;
        auVar38._8_4_ = fStack_220;
        auVar38._12_4_ = fStack_21c;
        auVar232 = minps(auVar38,_DAT_01f7ba10);
        auVar232 = maxps(auVar232,auVar196);
        local_108._0_4_ = (auVar251._0_4_ + 0.0) * 0.25 * fVar253 + local_1f8;
        local_108._4_4_ = (auVar251._4_4_ + 1.0) * 0.25 * fVar253 + local_1f8;
        local_108._8_4_ = (auVar251._8_4_ + 2.0) * 0.25 * fVar253 + local_1f8;
        local_108._12_4_ = (auVar251._12_4_ + 3.0) * 0.25 * fVar253 + local_1f8;
        local_118[0] = (auVar232._0_4_ + 0.0) * 0.25 * fVar253 + local_1f8;
        local_118[1] = (auVar232._4_4_ + 1.0) * 0.25 * fVar253 + local_1f8;
        local_118[2] = (auVar232._8_4_ + 2.0) * 0.25 * fVar253 + local_1f8;
        local_118[3] = (auVar232._12_4_ + 3.0) * 0.25 * fVar253 + local_1f8;
        fVar162 = fVar162 - auVar164._0_4_ * auVar164._0_4_;
        fVar175 = fVar175 - auVar164._4_4_ * auVar164._4_4_;
        fVar199 = fVar199 - auVar164._8_4_ * auVar164._8_4_;
        fVar201 = fVar201 - auVar164._12_4_ * auVar164._12_4_;
        auVar167._0_4_ = local_1e8 * local_1e8 - (float)local_588._0_4_ * fVar162;
        auVar167._4_4_ = fStack_1e4 * fStack_1e4 - (float)local_588._4_4_ * fVar175;
        auVar167._8_4_ = fStack_1e0 * fStack_1e0 - fStack_580 * fVar199;
        auVar167._12_4_ = fStack_1dc * fStack_1dc - fStack_57c * fVar201;
        local_508._4_4_ = -(uint)(0.0 <= auVar167._4_4_);
        local_508._0_4_ = -(uint)(0.0 <= auVar167._0_4_);
        fStack_500 = (float)-(uint)(0.0 <= auVar167._8_4_);
        fStack_4fc = (float)-(uint)(0.0 <= auVar167._12_4_);
        iVar62 = movmskps(iVar62,_local_508);
        if (iVar62 == 0) {
          _local_618 = ZEXT816(0);
          fVar261 = 0.0;
          fVar275 = 0.0;
          fVar280 = 0.0;
          fVar281 = 0.0;
          fVar253 = 0.0;
          fVar308 = 0.0;
          fVar255 = 0.0;
          fVar260 = 0.0;
          fVar283 = 0.0;
          fVar291 = 0.0;
          fVar293 = 0.0;
          fVar295 = 0.0;
          _local_578 = ZEXT816(0);
          iVar62 = 0;
          auVar108 = _DAT_01f7a9f0;
          auVar290 = _DAT_01f7aa00;
        }
        else {
          auVar232 = sqrtps(local_108,auVar167);
          auVar146._0_4_ = fVar229 + fVar229;
          auVar146._4_4_ = fVar243 + fVar243;
          auVar146._8_4_ = fVar254 + fVar254;
          auVar146._12_4_ = fVar273 + fVar273;
          auVar164 = rcpps(auVar167,auVar146);
          fVar297 = auVar164._0_4_;
          fVar305 = auVar164._4_4_;
          fVar306 = auVar164._8_4_;
          fVar307 = auVar164._12_4_;
          fVar297 = ((float)DAT_01f7ba10 - auVar146._0_4_ * fVar297) * fVar297 + fVar297;
          fVar305 = (DAT_01f7ba10._4_4_ - auVar146._4_4_ * fVar305) * fVar305 + fVar305;
          fVar306 = (DAT_01f7ba10._8_4_ - auVar146._8_4_ * fVar306) * fVar306 + fVar306;
          fVar307 = (DAT_01f7ba10._12_4_ - auVar146._12_4_ * fVar307) * fVar307 + fVar307;
          fVar309 = (-local_1e8 - auVar232._0_4_) * fVar297;
          fVar316 = (-fStack_1e4 - auVar232._4_4_) * fVar305;
          fVar318 = (-fStack_1e0 - auVar232._8_4_) * fVar306;
          fVar320 = (-fStack_1dc - auVar232._12_4_) * fVar307;
          fVar297 = (auVar232._0_4_ - local_1e8) * fVar297;
          fVar305 = (auVar232._4_4_ - fStack_1e4) * fVar305;
          fVar306 = (auVar232._8_4_ - fStack_1e0) * fVar306;
          fVar307 = (auVar232._12_4_ - fStack_1dc) * fVar307;
          local_288._0_4_ = auVar233._0_4_;
          local_288._4_4_ = auVar233._4_4_;
          fStack_280 = auVar233._8_4_;
          fStack_27c = auVar233._12_4_;
          fVar261 = ((float)local_288._0_4_ * fVar309 + local_1d8) * fVar173;
          fVar275 = ((float)local_288._4_4_ * fVar316 + fStack_1d4) * fVar195;
          fVar280 = (fStack_280 * fVar318 + fStack_1d0) * fVar200;
          fVar281 = (fStack_27c * fVar320 + fStack_1cc) * fVar227;
          fVar253 = fVar84 * fVar309 - (local_3f8 * fVar261 + fVar310);
          fVar308 = fVar84 * fVar316 - (fStack_3f4 * fVar275 + fVar317);
          fVar255 = fVar84 * fVar318 - (fStack_3f0 * fVar280 + fVar319);
          fVar260 = fVar84 * fVar320 - (fStack_3ec * fVar281 + fVar321);
          fVar283 = local_438 * fVar309 - ((float)local_3d8._0_4_ * fVar261 + fVar322);
          fVar291 = fStack_434 * fVar316 - ((float)local_3d8._4_4_ * fVar275 + fVar326);
          fVar293 = fStack_430 * fVar318 - (fStack_3d0 * fVar280 + fVar327);
          fVar295 = fStack_42c * fVar320 - (fStack_3cc * fVar281 + fVar328);
          local_578._4_4_ = fVar124 * fVar316 - (fVar275 * (float)local_3e8._4_4_ + fStack_554);
          local_578._0_4_ = fVar124 * fVar309 - (fVar261 * (float)local_3e8._0_4_ + local_558);
          fStack_570 = fVar124 * fVar318 - (fVar280 * fStack_3e0 + fStack_550);
          fStack_56c = fVar124 * fVar320 - (fVar281 * fStack_3dc + fStack_54c);
          fVar173 = ((float)local_288._0_4_ * fVar297 + local_1d8) * fVar173;
          fVar195 = ((float)local_288._4_4_ * fVar305 + fStack_1d4) * fVar195;
          fVar200 = (fStack_280 * fVar306 + fStack_1d0) * fVar200;
          fVar227 = (fStack_27c * fVar307 + fStack_1cc) * fVar227;
          local_618._4_4_ = fVar84 * fVar305 - (fStack_3f4 * fVar195 + fVar317);
          local_618._0_4_ = fVar84 * fVar297 - (local_3f8 * fVar173 + fVar310);
          fStack_610 = fVar84 * fVar306 - (fStack_3f0 * fVar200 + fVar319);
          fStack_60c = fVar84 * fVar307 - (fStack_3ec * fVar227 + fVar321);
          fVar261 = local_438 * fVar297 - ((float)local_3d8._0_4_ * fVar173 + fVar322);
          fVar275 = fStack_434 * fVar305 - ((float)local_3d8._4_4_ * fVar195 + fVar326);
          fVar280 = fStack_430 * fVar306 - (fStack_3d0 * fVar200 + fVar327);
          fVar281 = fStack_42c * fVar307 - (fStack_3cc * fVar227 + fVar328);
          bVar78 = 0.0 <= auVar167._0_4_;
          uVar79 = -(uint)bVar78;
          bVar23 = 0.0 <= auVar167._4_4_;
          uVar80 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar167._8_4_;
          uVar81 = -(uint)bVar24;
          bVar25 = 0.0 <= auVar167._12_4_;
          uVar82 = -(uint)bVar25;
          auVar196._0_4_ = fVar124 * fVar297 - (fVar173 * (float)local_3e8._0_4_ + local_558);
          auVar196._4_4_ = fVar124 * fVar305 - (fVar195 * (float)local_3e8._4_4_ + fStack_554);
          auVar196._8_4_ = fVar124 * fVar306 - (fVar200 * fStack_3e0 + fStack_550);
          auVar196._12_4_ = fVar124 * fVar307 - (fVar227 * fStack_3dc + fStack_54c);
          auVar235._0_4_ = (uint)fVar309 & uVar79;
          auVar235._4_4_ = (uint)fVar316 & uVar80;
          auVar235._8_4_ = (uint)fVar318 & uVar81;
          auVar235._12_4_ = (uint)fVar320 & uVar82;
          auVar108._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
          auVar108._8_4_ = ~uVar81 & 0x7f800000;
          auVar108._12_4_ = ~uVar82 & 0x7f800000;
          auVar108 = auVar108 | auVar235;
          auVar252._0_4_ = (uint)fVar297 & uVar79;
          auVar252._4_4_ = (uint)fVar305 & uVar80;
          auVar252._8_4_ = (uint)fVar306 & uVar81;
          auVar252._12_4_ = (uint)fVar307 & uVar82;
          auVar290._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
          auVar290._8_4_ = ~uVar81 & 0xff800000;
          auVar290._12_4_ = ~uVar82 & 0xff800000;
          auVar290 = auVar290 | auVar252;
          auVar147._0_8_ = CONCAT44(fStack_1c4,local_1c8) & 0x7fffffff7fffffff;
          auVar147._8_4_ = ABS(fStack_1c0);
          auVar147._12_4_ = ABS(fStack_1bc);
          auVar36._4_4_ = fStack_364;
          auVar36._0_4_ = local_368;
          auVar36._8_4_ = fStack_360;
          auVar36._12_4_ = fStack_35c;
          auVar164 = maxps(auVar36,auVar147);
          fVar173 = auVar164._0_4_ * 1.9073486e-06;
          fVar195 = auVar164._4_4_ * 1.9073486e-06;
          fVar200 = auVar164._8_4_ * 1.9073486e-06;
          fVar227 = auVar164._12_4_ * 1.9073486e-06;
          auVar221._0_4_ = -(uint)(ABS(fVar229) < fVar173 && bVar78);
          auVar221._4_4_ = -(uint)(ABS(fVar243) < fVar195 && bVar23);
          auVar221._8_4_ = -(uint)(ABS(fVar254) < fVar200 && bVar24);
          auVar221._12_4_ = -(uint)(ABS(fVar273) < fVar227 && bVar25);
          iVar62 = movmskps(iVar62,auVar221);
          if (iVar62 != 0) {
            uVar79 = -(uint)(fVar162 <= 0.0);
            uVar80 = -(uint)(fVar175 <= 0.0);
            uVar81 = -(uint)(fVar199 <= 0.0);
            uVar82 = -(uint)(fVar201 <= 0.0);
            auVar271._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar221._0_4_;
            auVar271._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar221._4_4_;
            auVar271._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar221._8_4_;
            auVar271._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar221._12_4_;
            auVar259._0_4_ = ~auVar221._0_4_ & auVar108._0_4_;
            auVar259._4_4_ = ~auVar221._4_4_ & auVar108._4_4_;
            auVar259._8_4_ = ~auVar221._8_4_ & auVar108._8_4_;
            auVar259._12_4_ = ~auVar221._12_4_ & auVar108._12_4_;
            auVar108 = auVar259 | auVar271;
            auVar272._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar221._0_4_;
            auVar272._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar221._4_4_;
            auVar272._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar221._8_4_;
            auVar272._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar221._12_4_;
            auVar226._0_4_ = ~auVar221._0_4_ & auVar290._0_4_;
            auVar226._4_4_ = ~auVar221._4_4_ & auVar290._4_4_;
            auVar226._8_4_ = ~auVar221._8_4_ & auVar290._8_4_;
            auVar226._12_4_ = ~auVar221._12_4_ & auVar290._12_4_;
            auVar290 = auVar226 | auVar272;
            local_508._4_4_ = -(uint)((fVar195 <= ABS(fVar243) || fVar175 <= 0.0) && bVar23);
            local_508._0_4_ = -(uint)((fVar173 <= ABS(fVar229) || fVar162 <= 0.0) && bVar78);
            fStack_500 = (float)-(uint)((fVar200 <= ABS(fVar254) || fVar199 <= 0.0) && bVar24);
            fStack_4fc = (float)-(uint)((fVar227 <= ABS(fVar273) || fVar201 <= 0.0) && bVar25);
          }
        }
        fVar261 = fVar261 * local_438;
        fVar275 = fVar275 * fStack_434;
        fVar280 = fVar280 * fStack_430;
        fVar281 = fVar281 * fStack_42c;
        _local_138 = auVar267;
        local_128 = minps(auVar85,auVar108);
        _local_2b8 = maxps(auVar267,auVar290);
        local_2a8 = auVar85;
        auVar236._0_4_ = -(uint)(fVar242 <= local_128._0_4_) & auVar325._0_4_;
        auVar236._4_4_ = -(uint)(fVar244 <= local_128._4_4_) & auVar325._4_4_;
        auVar236._8_4_ = -(uint)(fVar262 <= local_128._8_4_) & auVar325._8_4_;
        auVar236._12_4_ = -(uint)(fVar274 <= local_128._12_4_) & auVar325._12_4_;
        fVar195 = local_2b8._12_4_;
        fVar162 = local_2b8._0_4_;
        fVar173 = local_2b8._4_4_;
        fVar175 = local_2b8._8_4_;
        auVar185._0_8_ =
             CONCAT44(-(uint)(fVar173 <= auVar85._4_4_) & auVar325._4_4_,
                      -(uint)(fVar162 <= auVar85._0_4_) & auVar325._0_4_);
        auVar185._8_4_ = -(uint)(fVar175 <= auVar85._8_4_) & auVar325._8_4_;
        auVar185._12_4_ = -(uint)(fVar195 <= auVar85._12_4_) & auVar325._12_4_;
        auVar109._8_4_ = auVar185._8_4_;
        auVar109._0_8_ = auVar185._0_8_;
        auVar109._12_4_ = auVar185._12_4_;
        iVar62 = movmskps(iVar62,auVar109 | auVar236);
        if (iVar62 != 0) {
          _local_3e8 = auVar185;
          local_3f8 = fVar160;
          fStack_3f4 = fVar160;
          fStack_3f0 = fVar160;
          fStack_3ec = fVar160;
          local_578._0_4_ =
               -(uint)((int)fVar160 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._0_4_ * fVar124 +
                                                 fVar283 * local_438 + fVar253 * fVar84)) &
                             local_508._0_4_) << 0x1f) >> 0x1f) + 4);
          local_578._4_4_ =
               -(uint)((int)fVar160 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_578._4_4_ * fVar124 +
                                                 fVar291 * fStack_434 + fVar308 * fVar84)) &
                             local_508._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_570 = (float)-(uint)((int)fVar160 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_570 * fVar124 +
                                                                fVar293 * fStack_430 +
                                                                fVar255 * fVar84)) &
                                            (uint)fStack_500) << 0x1f) >> 0x1f) + 4);
          fStack_56c = (float)-(uint)((int)fVar160 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_56c * fVar124 +
                                                                fVar295 * fStack_42c +
                                                                fVar260 * fVar84)) &
                                            (uint)fStack_4fc) << 0x1f) >> 0x1f) + 4);
          _local_3d8 = auVar236;
          local_3a8 = ~_local_578 & auVar236;
          iVar62 = movmskps(iVar62,local_3a8);
          if (iVar62 != 0) {
            fVar242 = local_568 + fVar242;
            fVar244 = fStack_564 + fVar244;
            fVar262 = fStack_560 + fVar262;
            fVar274 = fStack_55c + fVar274;
            _local_588 = _local_2b8;
            do {
              auVar164 = ~local_3a8 & _DAT_01f7a9f0 | local_3a8 & auVar267;
              auVar186._4_4_ = auVar164._0_4_;
              auVar186._0_4_ = auVar164._4_4_;
              auVar186._8_4_ = auVar164._12_4_;
              auVar186._12_4_ = auVar164._8_4_;
              auVar85 = minps(auVar186,auVar164);
              auVar148._0_8_ = auVar85._8_8_;
              auVar148._8_4_ = auVar85._0_4_;
              auVar148._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar148,auVar85);
              auVar149._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar164._4_4_) & local_3a8._4_4_,
                            -(uint)(auVar85._0_4_ == auVar164._0_4_) & local_3a8._0_4_);
              auVar149._8_4_ = -(uint)(auVar85._8_4_ == auVar164._8_4_) & local_3a8._8_4_;
              auVar149._12_4_ = -(uint)(auVar85._12_4_ == auVar164._12_4_) & local_3a8._12_4_;
              iVar62 = movmskps(iVar62,auVar149);
              auVar110 = local_3a8;
              if (iVar62 != 0) {
                auVar110._8_4_ = auVar149._8_4_;
                auVar110._0_8_ = auVar149._0_8_;
                auVar110._12_4_ = auVar149._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar110);
              lVar22 = 0;
              if (CONCAT44(uVar70,uVar63) != 0) {
                for (; (CONCAT44(uVar70,uVar63) >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              *(undefined4 *)(local_3a8 + lVar22 * 4) = 0;
              auVar33._4_4_ = fStack_404;
              auVar33._0_4_ = local_408;
              auVar33._8_4_ = fStack_400;
              auVar33._12_4_ = fStack_3fc;
              auVar31._4_4_ = fStack_414;
              auVar31._0_4_ = local_418;
              auVar31._8_4_ = fStack_410;
              auVar31._12_4_ = fStack_40c;
              auVar164 = minps(auVar33,auVar31);
              auVar232 = maxps(auVar33,auVar31);
              auVar29._4_4_ = fStack_424;
              auVar29._0_4_ = local_428;
              auVar29._8_4_ = fStack_420;
              auVar29._12_4_ = fStack_41c;
              auVar27._4_4_ = fStack_544;
              auVar27._0_4_ = local_548;
              auVar27._8_4_ = fStack_540;
              auVar27._12_4_ = fStack_53c;
              auVar85 = minps(auVar29,auVar27);
              auVar164 = minps(auVar164,auVar85);
              auVar85 = maxps(auVar29,auVar27);
              auVar85 = maxps(auVar232,auVar85);
              auVar168._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
              auVar168._8_4_ = auVar164._8_4_ & 0x7fffffff;
              auVar168._12_4_ = auVar164._12_4_ & 0x7fffffff;
              local_4f8 = auVar85._12_4_;
              auVar111._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar111._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar111._12_4_ = ABS(local_4f8);
              auVar85 = maxps(auVar168,auVar111);
              fVar162 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar162 = auVar85._0_4_;
              }
              auVar169._8_8_ = auVar85._8_8_;
              auVar169._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar162) {
                auVar169._0_4_ = fVar162;
              }
              register0x00001284 = auVar169._4_12_;
              local_488._0_4_ = auVar169._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar162 = *(float *)(local_108 + lVar22 * 4);
              fVar173 = *(float *)(local_138 + lVar22 * 4);
              bVar78 = true;
              uVar75 = 0;
              do {
                fVar201 = SQRT(fVar161) * 1.9073486e-06 * fVar173;
                fVar175 = 1.0 - fVar162;
                fVar228 = local_418 * fVar175 + local_428 * fVar162;
                fVar229 = fStack_414 * fVar175 + fStack_424 * fVar162;
                fVar253 = fStack_410 * fVar175 + fStack_420 * fVar162;
                fVar254 = fStack_40c * fVar175 + fStack_41c * fVar162;
                fVar195 = (local_408 * fVar175 + local_418 * fVar162) * fVar175 + fVar162 * fVar228;
                fVar199 = (fStack_404 * fVar175 + fStack_414 * fVar162) * fVar175 +
                          fVar162 * fVar229;
                fVar200 = (fStack_400 * fVar175 + fStack_410 * fVar162) * fVar175 +
                          fVar162 * fVar253;
                fVar227 = (fStack_3fc * fVar175 + fStack_40c * fVar162) * fVar175 +
                          fVar162 * fVar254;
                fVar228 = fVar228 * fVar175 + (local_428 * fVar175 + local_548 * fVar162) * fVar162;
                fVar243 = fVar229 * fVar175 +
                          (fStack_424 * fVar175 + fStack_544 * fVar162) * fVar162;
                fVar253 = fVar253 * fVar175 +
                          (fStack_420 * fVar175 + fStack_540 * fVar162) * fVar162;
                fVar254 = fVar254 * fVar175 +
                          (fStack_41c * fVar175 + fStack_53c * fVar162) * fVar162;
                local_558 = fVar175 * fVar195 + fVar162 * fVar228;
                fStack_554 = fVar175 * fVar199 + fVar162 * fVar243;
                fStack_550 = fVar175 * fVar200 + fVar162 * fVar253;
                fStack_54c = fVar175 * fVar227 + fVar162 * fVar254;
                fVar229 = (fVar228 - fVar195) * 3.0;
                fVar243 = (fVar243 - fVar199) * 3.0;
                fVar253 = (fVar253 - fVar200) * 3.0;
                fVar254 = (fVar254 - fVar227) * 3.0;
                fVar195 = fVar175 * 6.0;
                fVar227 = (fVar162 - (fVar175 + fVar175)) * 6.0;
                fVar228 = (fVar175 - (fVar162 + fVar162)) * 6.0;
                fVar175 = fVar162 * 6.0;
                fVar199 = fVar195 * local_408 +
                          fVar227 * local_418 + fVar228 * local_428 + fVar175 * local_548;
                fVar200 = fVar195 * fStack_404 +
                          fVar227 * fStack_414 + fVar228 * fStack_424 + fVar175 * fStack_544;
                fVar195 = fVar195 * fStack_400 +
                          fVar227 * fStack_410 + fVar228 * fStack_420 + fVar175 * fStack_540;
                fVar273 = (fVar173 * fVar174 + 0.0) - local_558;
                fVar308 = (fVar173 * fVar122 + 0.0) - fStack_554;
                fVar255 = (fVar173 * fVar124 + 0.0) - fStack_550;
                fStack_48c = (fVar173 * 0.0 + 0.0) - fStack_54c;
                fVar175 = fVar308 * fVar308;
                fVar227 = fVar255 * fVar255;
                fVar228 = fStack_48c * fStack_48c;
                auVar315._0_4_ = fVar175 + fVar273 * fVar273 + fVar227;
                auVar315._4_4_ = fVar175 + fVar175 + fVar228;
                auVar315._8_4_ = fVar175 + fVar227 + fVar227;
                auVar315._12_4_ = fVar175 + fVar228 + fVar228;
                fVar175 = (float)local_488._0_4_;
                if ((float)local_488._0_4_ <= fVar201) {
                  fVar175 = fVar201;
                }
                fVar228 = fVar243 * fVar243 + fVar229 * fVar229 + fVar253 * fVar253;
                auVar85 = ZEXT416((uint)fVar228);
                auVar164 = rsqrtss(ZEXT416((uint)fVar228),auVar85);
                fVar201 = auVar164._0_4_;
                fVar260 = fVar201 * 1.5 - fVar201 * fVar201 * fVar228 * 0.5 * fVar201;
                fVar305 = fVar229 * fVar260;
                fVar306 = fVar243 * fVar260;
                fVar307 = fVar253 * fVar260;
                fVar309 = fVar254 * fVar260;
                fVar297 = fVar253 * fVar195 + fVar243 * fVar200 + fVar229 * fVar199;
                auVar85 = rcpss(auVar85,auVar85);
                fVar227 = (2.0 - fVar228 * auVar85._0_4_) * auVar85._0_4_;
                fVar201 = fVar308 * fVar306;
                fVar283 = fVar255 * fVar307;
                fVar291 = fStack_48c * fVar309;
                fVar293 = fVar201 + fVar273 * fVar305 + fVar283;
                fVar295 = fVar201 + fVar201 + fVar291;
                fVar283 = fVar201 + fVar283 + fVar283;
                fVar291 = fVar201 + fVar291 + fVar291;
                fVar316 = (SQRT(auVar315._0_4_) + 1.0) * ((float)local_488._0_4_ / SQRT(fVar228)) +
                          SQRT(auVar315._0_4_) * (float)local_488._0_4_ + fVar175;
                fVar201 = fVar309 * 0.0;
                fVar309 = fVar309 * -fVar254;
                fVar297 = fVar307 * -fVar253 + fVar306 * -fVar243 + fVar305 * -fVar229 +
                          fVar227 * (fVar228 * fVar195 - fVar297 * fVar253) * fVar260 * fVar255 +
                          fVar227 * (fVar228 * fVar200 - fVar297 * fVar243) * fVar260 * fVar308 +
                          fVar227 * (fVar228 * fVar199 - fVar297 * fVar229) * fVar260 * fVar273;
                fVar200 = fVar124 * fVar307 + fVar122 * fVar306 + fVar174 * fVar305;
                fVar227 = auVar315._0_4_ - fVar293 * fVar293;
                auVar112._0_8_ = CONCAT44(auVar315._4_4_ - fVar295 * fVar295,fVar227);
                auVar112._8_4_ = auVar315._8_4_ - fVar283 * fVar283;
                auVar112._12_4_ = auVar315._12_4_ - fVar291 * fVar291;
                fVar260 = -fVar254 * fStack_48c;
                local_5a8 = CONCAT44(fVar309,fVar297);
                local_498._4_4_ = fVar308;
                local_498._0_4_ = fVar273;
                fStack_490 = fVar255;
                fVar199 = fStack_48c * 0.0;
                fVar195 = (fVar124 * fVar255 + fVar122 * fVar308 + fVar174 * fVar273) -
                          fVar293 * fVar200;
                auVar150._8_4_ = auVar112._8_4_;
                auVar150._0_8_ = auVar112._0_8_;
                auVar150._12_4_ = auVar112._12_4_;
                auVar85 = rsqrtss(auVar150,auVar112);
                fVar228 = auVar85._0_4_;
                auVar187._0_4_ = fVar228 * 1.5 - fVar228 * fVar228 * fVar227 * 0.5 * fVar228;
                auVar187._4_12_ = auVar85._4_12_;
                if (fVar227 < 0.0) {
                  local_4b8._4_4_ = local_488._4_4_;
                  local_4b8._0_4_ = fVar175;
                  local_4b8._8_4_ = fStack_480;
                  local_4b8._12_4_ = fStack_47c;
                  _local_4e8 = auVar187;
                  local_4d8 = fVar195;
                  fStack_4d4 = fVar199;
                  fStack_4d0 = fVar124 * fVar255;
                  fStack_4cc = fVar199;
                  local_4c8 = fVar200;
                  fStack_4c4 = fVar201;
                  fStack_4c0 = fVar124 * fVar307;
                  fStack_4bc = fVar201;
                  _local_4a8 = auVar315;
                  fVar227 = sqrtf(fVar227);
                  auVar187 = _local_4e8;
                  auVar315 = _local_4a8;
                  fVar175 = (float)local_4b8._0_4_;
                  fVar195 = local_4d8;
                  fVar199 = fStack_4d4;
                  fVar200 = local_4c8;
                  fVar201 = fStack_4c4;
                }
                else {
                  fVar227 = SQRT(fVar227);
                }
                fVar227 = fVar227 - fStack_54c;
                fVar228 = ((-fVar253 * fVar255 + -fVar243 * fVar308 + -fVar229 * fVar273) -
                          fVar293 * fVar297) * auVar187._0_4_ - fVar254;
                fVar195 = fVar195 * auVar187._0_4_;
                auVar188._0_4_ = fVar297 * fVar195 - fVar200 * fVar228;
                auVar223._8_4_ = -fVar260;
                auVar223._0_8_ = CONCAT44(fVar260,fVar228) ^ 0x8000000000000000;
                auVar223._12_4_ = fVar199;
                auVar222._8_8_ = auVar223._8_8_;
                auVar222._0_8_ = CONCAT44(fVar195,fVar228) ^ 0x80000000;
                auVar188._4_4_ = auVar188._0_4_;
                auVar188._8_4_ = auVar188._0_4_;
                auVar188._12_4_ = auVar188._0_4_;
                auVar85 = divps(auVar222,auVar188);
                auVar238._8_4_ = fVar309;
                auVar238._0_8_ = local_5a8;
                auVar238._12_4_ = -fVar201;
                auVar237._8_8_ = auVar238._8_8_;
                auVar237._0_8_ = CONCAT44(fVar200,fVar297) ^ 0x8000000000000000;
                auVar164 = divps(auVar237,auVar188);
                fVar173 = fVar173 - (fVar227 * auVar164._0_4_ + fVar293 * auVar85._0_4_);
                fVar162 = fVar162 - (fVar227 * auVar164._4_4_ + fVar293 * auVar85._4_4_);
                if ((ABS(fVar293) < fVar316) &&
                   (ABS(fVar227) < local_4f8 * 1.9073486e-06 + fVar175 + fVar316)) {
                  fVar173 = (float)local_3c8._0_4_ + fVar173;
                  if ((fVar123 <= fVar173) &&
                     (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar173 <= fVar175)) {
                    uVar66 = 0;
                    if ((fVar162 < 0.0) || (1.0 < fVar162)) goto LAB_00ae1651;
                    auVar85 = rsqrtss(auVar315,auVar315);
                    fVar195 = auVar85._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_470].ptr;
                    pRVar71 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar66 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar201 = fVar195 * 1.5 +
                                  fVar195 * fVar195 * auVar315._0_4_ * -0.5 * fVar195;
                        fVar227 = (float)local_498._0_4_ * fVar201;
                        fVar273 = (float)local_498._4_4_ * fVar201;
                        fVar201 = fStack_490 * fVar201;
                        fVar195 = fVar254 * fVar227 + fVar229;
                        fVar199 = fVar254 * fVar273 + fVar243;
                        fVar200 = fVar254 * fVar201 + fVar253;
                        fVar228 = fVar273 * fVar229 - fVar243 * fVar227;
                        fVar243 = fVar201 * fVar243 - fVar253 * fVar273;
                        fVar201 = fVar227 * fVar253 - fVar229 * fVar201;
                        local_328 = fVar243 * fVar199 - fVar201 * fVar195;
                        local_348._4_4_ = fVar201 * fVar200 - fVar228 * fVar199;
                        local_338 = fVar228 * fVar195 - fVar243 * fVar200;
                        local_348._0_4_ = local_348._4_4_;
                        fStack_340 = (float)local_348._4_4_;
                        fStack_33c = (float)local_348._4_4_;
                        fStack_334 = local_338;
                        fStack_330 = local_338;
                        fStack_32c = local_338;
                        fStack_324 = local_328;
                        fStack_320 = local_328;
                        fStack_31c = local_328;
                        local_318 = fVar162;
                        fStack_314 = fVar162;
                        fStack_310 = fVar162;
                        fStack_30c = fVar162;
                        local_308 = 0;
                        uStack_300 = 0;
                        local_2f8 = CONCAT44(uStack_384,local_388);
                        uStack_2f0 = CONCAT44(uStack_37c,uStack_380);
                        local_2e8 = CONCAT44(uStack_374,local_378);
                        uStack_2e0 = CONCAT44(uStack_36c,uStack_370);
                        local_2d8 = context->user->instID[0];
                        uStack_2d4 = local_2d8;
                        uStack_2d0 = local_2d8;
                        uStack_2cc = local_2d8;
                        local_2c8 = context->user->instPrimID[0];
                        uStack_2c4 = local_2c8;
                        uStack_2c0 = local_2c8;
                        uStack_2bc = local_2c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar173;
                        local_598 = *local_478;
                        _local_538 = (int *)local_598;
                        uStack_530 = pGVar19->userPtr;
                        local_528 = context->user;
                        local_520 = ray;
                        local_518 = (RTCHitN *)local_348;
                        local_510 = 4;
                        p_Var69 = pGVar19->occlusionFilterN;
                        if (p_Var69 != (RTCFilterFunctionN)0x0) {
                          p_Var69 = (RTCFilterFunctionN)
                                    (*p_Var69)((RTCFilterFunctionNArguments *)local_538);
                        }
                        auVar151._0_4_ = -(uint)(local_598._0_4_ == 0);
                        auVar151._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar151._8_4_ = -(uint)(local_598._8_4_ == 0);
                        auVar151._12_4_ = -(uint)(local_598._12_4_ == 0);
                        uVar79 = movmskps((int)p_Var69,auVar151);
                        pRVar67 = (RayK<4> *)(ulong)(uVar79 ^ 0xf);
                        if ((uVar79 ^ 0xf) == 0) {
                          auVar151 = auVar151 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar71->filter)(local_538);
                          }
                          auVar113._0_4_ = -(uint)(local_598._0_4_ == 0);
                          auVar113._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar113._8_4_ = -(uint)(local_598._8_4_ == 0);
                          auVar113._12_4_ = -(uint)(local_598._12_4_ == 0);
                          auVar151 = auVar113 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_520 + 0x80) =
                               ~auVar113 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_520 + 0x80) & auVar113;
                          pRVar67 = local_520;
                        }
                        auVar152._0_4_ = auVar151._0_4_ << 0x1f;
                        auVar152._4_4_ = auVar151._4_4_ << 0x1f;
                        auVar152._8_4_ = auVar151._8_4_ << 0x1f;
                        auVar152._12_4_ = auVar151._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar67,auVar152);
                        uVar66 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar67 >> 0x20),iVar62) >> 8
                                                ),iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar175;
                        }
                      }
                      goto LAB_00ae1651;
                    }
                  }
                  uVar66 = 0;
                  goto LAB_00ae1651;
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              uVar66 = 5;
LAB_00ae1651:
              fVar228 = *(float *)(ray + k * 4 + 0x80);
              local_3a8._0_4_ = -(uint)(fVar242 <= fVar228) & local_3a8._0_4_;
              local_3a8._4_4_ = -(uint)(fVar244 <= fVar228) & local_3a8._4_4_;
              local_3a8._8_4_ = -(uint)(fVar262 <= fVar228) & local_3a8._8_4_;
              local_3a8._12_4_ = -(uint)(fVar274 <= fVar228) & local_3a8._12_4_;
              bVar74 = (bool)(bVar74 | bVar78 & (byte)uVar66);
              uVar70 = (undefined4)((ulong)uVar66 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_3a8);
            } while (iVar62 != 0);
            fVar162 = (float)local_588._0_4_;
            fVar173 = (float)local_588._4_4_;
            fVar175 = fStack_580;
            fVar195 = fStack_57c;
          }
          auVar85 = _local_2b8;
          uVar63 = SUB84(pRVar71,0);
          local_588._0_4_ = -(uint)(fVar162 + local_568 <= fVar228) & local_3e8._0_4_;
          local_588._4_4_ = -(uint)(fVar173 + fStack_564 <= fVar228) & local_3e8._4_4_;
          fStack_580 = (float)(-(uint)(fVar175 + fStack_560 <= fVar228) & (uint)fStack_3e0);
          fStack_57c = (float)(-(uint)(fVar195 + fStack_55c <= fVar228) & (uint)fStack_3dc);
          auVar116._0_4_ =
               -(uint)((int)local_3f8 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_618._0_4_ * fVar84 +
                                                 fVar261 + auVar196._0_4_ * fVar124)) &
                             local_508._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar116._4_4_ =
               -(uint)((int)fStack_3f4 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_618._4_4_ * fVar84 +
                                                 fVar275 + auVar196._4_4_ * fVar124)) &
                             local_508._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar116._8_4_ =
               -(uint)((int)fStack_3f0 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_610 * fVar84 +
                                                 fVar280 + auVar196._8_4_ * fVar124)) &
                             (uint)fStack_500) << 0x1f) >> 0x1f) + 4);
          auVar116._12_4_ =
               -(uint)((int)fStack_3ec <
                      ((int)((-(uint)(0.3 <= ABS(fStack_60c * fVar84 +
                                                 fVar281 + auVar196._12_4_ * fVar124)) &
                             (uint)fStack_4fc) << 0x1f) >> 0x1f) + 4);
          local_3b8 = ~auVar116 & _local_588;
          iVar62 = movmskps(0,local_3b8);
          local_638 = local_2b8._0_4_;
          fStack_634 = local_2b8._4_4_;
          fStack_630 = local_2b8._8_4_;
          fStack_62c = local_2b8._12_4_;
          local_2b8._0_4_ = local_638;
          local_2b8._4_4_ = fStack_634;
          fStack_2b0 = fStack_630;
          fStack_2ac = fStack_62c;
          if (iVar62 != 0) {
            local_638 = local_568 + local_638;
            fStack_634 = fStack_564 + fStack_634;
            fStack_630 = fStack_560 + fStack_630;
            fStack_62c = fStack_55c + fStack_62c;
            do {
              auVar267 = ~local_3b8 & _DAT_01f7a9f0 | local_3b8 & auVar85;
              auVar190._4_4_ = auVar267._0_4_;
              auVar190._0_4_ = auVar267._4_4_;
              auVar190._8_4_ = auVar267._12_4_;
              auVar190._12_4_ = auVar267._8_4_;
              auVar164 = minps(auVar190,auVar267);
              auVar154._0_8_ = auVar164._8_8_;
              auVar154._8_4_ = auVar164._0_4_;
              auVar154._12_4_ = auVar164._4_4_;
              auVar164 = minps(auVar154,auVar164);
              auVar155._0_8_ =
                   CONCAT44(-(uint)(auVar164._4_4_ == auVar267._4_4_) & local_3b8._4_4_,
                            -(uint)(auVar164._0_4_ == auVar267._0_4_) & local_3b8._0_4_);
              auVar155._8_4_ = -(uint)(auVar164._8_4_ == auVar267._8_4_) & local_3b8._8_4_;
              auVar155._12_4_ = -(uint)(auVar164._12_4_ == auVar267._12_4_) & local_3b8._12_4_;
              iVar62 = movmskps(iVar62,auVar155);
              auVar117 = local_3b8;
              if (iVar62 != 0) {
                auVar117._8_4_ = auVar155._8_4_;
                auVar117._0_8_ = auVar155._0_8_;
                auVar117._12_4_ = auVar155._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar117);
              lVar22 = 0;
              if (CONCAT44(uVar70,uVar63) != 0) {
                for (; (CONCAT44(uVar70,uVar63) >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              *(undefined4 *)(local_3b8 + lVar22 * 4) = 0;
              auVar34._4_4_ = fStack_404;
              auVar34._0_4_ = local_408;
              auVar34._8_4_ = fStack_400;
              auVar34._12_4_ = fStack_3fc;
              auVar32._4_4_ = fStack_414;
              auVar32._0_4_ = local_418;
              auVar32._8_4_ = fStack_410;
              auVar32._12_4_ = fStack_40c;
              auVar232 = minps(auVar34,auVar32);
              auVar267 = maxps(auVar34,auVar32);
              auVar30._4_4_ = fStack_424;
              auVar30._0_4_ = local_428;
              auVar30._8_4_ = fStack_420;
              auVar30._12_4_ = fStack_41c;
              auVar28._4_4_ = fStack_544;
              auVar28._0_4_ = local_548;
              auVar28._8_4_ = fStack_540;
              auVar28._12_4_ = fStack_53c;
              auVar164 = minps(auVar30,auVar28);
              auVar232 = minps(auVar232,auVar164);
              auVar164 = maxps(auVar30,auVar28);
              auVar164 = maxps(auVar267,auVar164);
              auVar197._0_8_ = auVar232._0_8_ & 0x7fffffff7fffffff;
              auVar197._8_4_ = auVar232._8_4_ & 0x7fffffff;
              auVar197._12_4_ = auVar232._12_4_ & 0x7fffffff;
              local_4f8 = auVar164._12_4_;
              auVar118._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
              auVar118._8_4_ = auVar164._8_4_ & 0x7fffffff;
              auVar118._12_4_ = ABS(local_4f8);
              auVar164 = maxps(auVar197,auVar118);
              fVar162 = auVar164._4_4_;
              if (auVar164._4_4_ <= auVar164._0_4_) {
                fVar162 = auVar164._0_4_;
              }
              auVar198._8_8_ = auVar164._8_8_;
              auVar198._0_8_ = auVar164._8_8_;
              if (auVar164._8_4_ <= fVar162) {
                auVar198._0_4_ = fVar162;
              }
              fVar175 = auVar198._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar162 = local_118[lVar22];
              fVar173 = *(float *)(local_2a8 + lVar22 * 4);
              bVar78 = true;
              uVar75 = 0;
              do {
                fVar200 = SQRT(fVar161) * 1.9073486e-06 * fVar173;
                fVar228 = 1.0 - fVar162;
                fVar229 = local_418 * fVar228 + local_428 * fVar162;
                fVar242 = fStack_414 * fVar228 + fStack_424 * fVar162;
                fVar243 = fStack_410 * fVar228 + fStack_420 * fVar162;
                fVar244 = fStack_40c * fVar228 + fStack_41c * fVar162;
                fVar195 = (local_408 * fVar228 + local_418 * fVar162) * fVar228 + fVar162 * fVar229;
                fVar199 = (fStack_404 * fVar228 + fStack_414 * fVar162) * fVar228 +
                          fVar162 * fVar242;
                fVar201 = (fStack_400 * fVar228 + fStack_410 * fVar162) * fVar228 +
                          fVar162 * fVar243;
                fVar227 = (fStack_3fc * fVar228 + fStack_40c * fVar162) * fVar228 +
                          fVar162 * fVar244;
                fVar229 = fVar229 * fVar228 + (local_428 * fVar228 + local_548 * fVar162) * fVar162;
                fVar242 = fVar242 * fVar228 +
                          (fStack_424 * fVar228 + fStack_544 * fVar162) * fVar162;
                fVar253 = fVar243 * fVar228 +
                          (fStack_420 * fVar228 + fStack_540 * fVar162) * fVar162;
                fVar254 = fVar244 * fVar228 +
                          (fStack_41c * fVar228 + fStack_53c * fVar162) * fVar162;
                local_558 = fVar228 * fVar195 + fVar162 * fVar229;
                fStack_554 = fVar228 * fVar199 + fVar162 * fVar242;
                fStack_550 = fVar228 * fVar201 + fVar162 * fVar253;
                fStack_54c = fVar228 * fVar227 + fVar162 * fVar254;
                fVar243 = (fVar229 - fVar195) * 3.0;
                fVar244 = (fVar242 - fVar199) * 3.0;
                fVar253 = (fVar253 - fVar201) * 3.0;
                fVar199 = (fVar254 - fVar227) * 3.0;
                fVar229 = fVar228 * 6.0;
                fVar201 = (fVar162 - (fVar228 + fVar228)) * 6.0;
                fVar227 = (fVar228 - (fVar162 + fVar162)) * 6.0;
                fVar195 = fVar162 * 6.0;
                fVar228 = fVar229 * local_408 +
                          fVar201 * local_418 + fVar227 * local_428 + fVar195 * local_548;
                fVar242 = fVar229 * fStack_404 +
                          fVar201 * fStack_414 + fVar227 * fStack_424 + fVar195 * fStack_544;
                fVar201 = fVar229 * fStack_400 +
                          fVar201 * fStack_410 + fVar227 * fStack_420 + fVar195 * fStack_540;
                fVar227 = (fVar173 * fVar174 + 0.0) - local_558;
                fVar229 = (fVar173 * fVar122 + 0.0) - fStack_554;
                fVar254 = (fVar173 * fVar124 + 0.0) - fStack_550;
                fVar262 = (fVar173 * 0.0 + 0.0) - fStack_54c;
                fVar195 = fVar229 * fVar229;
                fStack_480 = fVar254 * fVar254;
                fStack_47c = fVar262 * fVar262;
                local_488._0_4_ = fVar195 + fVar227 * fVar227 + fStack_480;
                local_488._4_4_ = fVar195 + fVar195 + fStack_47c;
                fStack_480 = fVar195 + fStack_480 + fStack_480;
                fStack_47c = fVar195 + fStack_47c + fStack_47c;
                uStack_694 = auVar198._4_4_;
                uStack_690 = auVar198._8_4_;
                uStack_68c = auVar198._12_4_;
                fVar195 = fVar175;
                if (fVar175 <= fVar200) {
                  fVar195 = fVar200;
                }
                fVar274 = fVar244 * fVar244 + fVar243 * fVar243 + fVar253 * fVar253;
                auVar164 = ZEXT416((uint)fVar274);
                auVar267 = rsqrtss(ZEXT416((uint)fVar274),auVar164);
                fVar200 = auVar267._0_4_;
                fVar308 = fVar200 * 1.5 - fVar200 * fVar200 * fVar274 * 0.5 * fVar200;
                fVar283 = fVar243 * fVar308;
                fVar291 = fVar244 * fVar308;
                fVar293 = fVar253 * fVar308;
                fVar295 = fVar199 * fVar308;
                fVar280 = fVar253 * fVar201 + fVar244 * fVar242 + fVar243 * fVar228;
                auVar164 = rcpss(auVar164,auVar164);
                fVar200 = (2.0 - fVar274 * auVar164._0_4_) * auVar164._0_4_;
                fVar273 = fVar229 * fVar291;
                fVar255 = fVar254 * fVar293;
                fVar260 = fVar262 * fVar295;
                fVar261 = fVar273 + fVar227 * fVar283 + fVar255;
                fVar275 = fVar273 + fVar273 + fVar260;
                fVar255 = fVar273 + fVar255 + fVar255;
                fVar260 = fVar273 + fVar260 + fVar260;
                fVar281 = (SQRT((float)local_488._0_4_) + 1.0) * (fVar175 / SQRT(fVar274)) +
                          SQRT((float)local_488._0_4_) * fVar175 + fVar195;
                fVar273 = fVar295 * 0.0;
                fVar295 = fVar295 * -fVar199;
                fVar280 = fVar293 * -fVar253 + fVar291 * -fVar244 + fVar283 * -fVar243 +
                          fVar200 * (fVar274 * fVar201 - fVar280 * fVar253) * fVar308 * fVar254 +
                          fVar200 * (fVar274 * fVar242 - fVar280 * fVar244) * fVar308 * fVar229 +
                          fVar200 * (fVar274 * fVar228 - fVar280 * fVar243) * fVar308 * fVar227;
                fVar228 = fVar124 * fVar293 + fVar122 * fVar291 + fVar174 * fVar283;
                fVar242 = (float)local_488._0_4_ - fVar261 * fVar261;
                auVar304._0_8_ = CONCAT44((float)local_488._4_4_ - fVar275 * fVar275,fVar242);
                auVar304._8_4_ = fStack_480 - fVar255 * fVar255;
                auVar304._12_4_ = fStack_47c - fVar260 * fVar260;
                fVar308 = -fVar199 * fVar262;
                local_5a8 = CONCAT44(fVar295,fVar280);
                fVar201 = fVar262 * 0.0;
                fVar200 = (fVar124 * fVar254 + fVar122 * fVar229 + fVar174 * fVar227) -
                          fVar261 * fVar228;
                auVar156._8_4_ = auVar304._8_4_;
                auVar156._0_8_ = auVar304._0_8_;
                auVar156._12_4_ = auVar304._12_4_;
                auVar164 = rsqrtss(auVar156,auVar304);
                fVar274 = auVar164._0_4_;
                auVar191._0_4_ = fVar274 * 1.5 - fVar274 * fVar274 * fVar242 * 0.5 * fVar274;
                auVar191._4_12_ = auVar164._4_12_;
                if (fVar242 < 0.0) {
                  local_498._4_4_ = fVar229;
                  local_498._0_4_ = fVar227;
                  fStack_490 = fVar254;
                  fStack_48c = fVar262;
                  local_4a8._4_4_ = fVar244;
                  local_4a8._0_4_ = fVar243;
                  fStack_4a0 = fVar253;
                  fStack_49c = fVar199;
                  local_4b8._4_4_ = uStack_694;
                  local_4b8._0_4_ = fVar195;
                  local_4b8._8_4_ = uStack_690;
                  local_4b8._12_4_ = uStack_68c;
                  _local_4e8 = auVar191;
                  local_4d8 = fVar200;
                  fStack_4d4 = fVar201;
                  fStack_4d0 = fVar124 * fVar254;
                  fStack_4cc = fVar201;
                  local_4c8 = fVar228;
                  fStack_4c4 = fVar273;
                  fStack_4c0 = fVar124 * fVar293;
                  fStack_4bc = fVar273;
                  fVar242 = sqrtf(fVar242);
                  auVar191 = _local_4e8;
                  fVar195 = (float)local_4b8._0_4_;
                  fVar262 = (float)local_4a8._0_4_;
                  fVar274 = (float)local_4a8._4_4_;
                  fVar255 = fStack_4a0;
                  fVar199 = fStack_49c;
                  fVar260 = (float)local_498._0_4_;
                  fVar275 = (float)local_498._4_4_;
                  fVar283 = fStack_490;
                  fVar200 = local_4d8;
                  fVar201 = fStack_4d4;
                  fVar228 = local_4c8;
                  fVar273 = fStack_4c4;
                }
                else {
                  fVar242 = SQRT(fVar242);
                  fVar262 = fVar243;
                  fVar274 = fVar244;
                  fVar255 = fVar253;
                  fVar260 = fVar227;
                  fVar275 = fVar229;
                  fVar283 = fVar254;
                }
                fVar242 = fVar242 - fStack_54c;
                fVar227 = ((-fVar253 * fVar254 + -fVar244 * fVar229 + -fVar243 * fVar227) -
                          fVar261 * fVar280) * auVar191._0_4_ - fVar199;
                fVar200 = fVar200 * auVar191._0_4_;
                auVar192._0_4_ = fVar280 * fVar200 - fVar228 * fVar227;
                auVar225._8_4_ = -fVar308;
                auVar225._0_8_ = CONCAT44(fVar308,fVar227) ^ 0x8000000000000000;
                auVar225._12_4_ = fVar201;
                auVar224._8_8_ = auVar225._8_8_;
                auVar224._0_8_ = CONCAT44(fVar200,fVar227) ^ 0x80000000;
                auVar192._4_4_ = auVar192._0_4_;
                auVar192._8_4_ = auVar192._0_4_;
                auVar192._12_4_ = auVar192._0_4_;
                auVar164 = divps(auVar224,auVar192);
                auVar240._8_4_ = fVar295;
                auVar240._0_8_ = local_5a8;
                auVar240._12_4_ = -fVar273;
                auVar239._8_8_ = auVar240._8_8_;
                auVar239._0_8_ = CONCAT44(fVar228,fVar280) ^ 0x8000000000000000;
                auVar267 = divps(auVar239,auVar192);
                fVar173 = fVar173 - (fVar242 * auVar267._0_4_ + fVar261 * auVar164._0_4_);
                fVar162 = fVar162 - (fVar242 * auVar267._4_4_ + fVar261 * auVar164._4_4_);
                if ((ABS(fVar261) < fVar281) &&
                   (ABS(fVar242) < local_4f8 * 1.9073486e-06 + fVar195 + fVar281)) {
                  fVar173 = (float)local_3c8._0_4_ + fVar173;
                  if ((fVar123 <= fVar173) &&
                     (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar173 <= fVar175)) {
                    uVar66 = 0;
                    if ((fVar162 < 0.0) || (1.0 < fVar162)) goto LAB_00ae216d;
                    auVar164 = rsqrtss(_local_488,_local_488);
                    fVar195 = auVar164._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_470].ptr;
                    pRVar71 = (RTCIntersectArguments *)context;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar66 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar195 = fVar195 * 1.5 +
                                  fVar195 * fVar195 * local_488._0_4_ * -0.5 * fVar195;
                        fVar260 = fVar260 * fVar195;
                        fVar275 = fVar275 * fVar195;
                        fVar283 = fVar283 * fVar195;
                        fVar195 = fVar199 * fVar260 + fVar262;
                        fVar200 = fVar199 * fVar275 + fVar274;
                        fVar199 = fVar199 * fVar283 + fVar255;
                        fVar201 = fVar275 * fVar262 - fVar274 * fVar260;
                        fVar227 = fVar283 * fVar274 - fVar255 * fVar275;
                        fVar228 = fVar260 * fVar255 - fVar262 * fVar283;
                        local_328 = fVar227 * fVar200 - fVar228 * fVar195;
                        local_348._4_4_ = fVar228 * fVar199 - fVar201 * fVar200;
                        local_338 = fVar201 * fVar195 - fVar227 * fVar199;
                        local_348._0_4_ = local_348._4_4_;
                        fStack_340 = (float)local_348._4_4_;
                        fStack_33c = (float)local_348._4_4_;
                        fStack_334 = local_338;
                        fStack_330 = local_338;
                        fStack_32c = local_338;
                        fStack_324 = local_328;
                        fStack_320 = local_328;
                        fStack_31c = local_328;
                        local_318 = fVar162;
                        fStack_314 = fVar162;
                        fStack_310 = fVar162;
                        fStack_30c = fVar162;
                        local_308 = 0;
                        uStack_300 = 0;
                        local_2f8 = CONCAT44(uStack_384,local_388);
                        uStack_2f0 = CONCAT44(uStack_37c,uStack_380);
                        local_2e8 = CONCAT44(uStack_374,local_378);
                        uStack_2e0 = CONCAT44(uStack_36c,uStack_370);
                        local_2d8 = context->user->instID[0];
                        uStack_2d4 = local_2d8;
                        uStack_2d0 = local_2d8;
                        uStack_2cc = local_2d8;
                        local_2c8 = context->user->instPrimID[0];
                        uStack_2c4 = local_2c8;
                        uStack_2c0 = local_2c8;
                        uStack_2bc = local_2c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar173;
                        local_598 = *local_478;
                        _local_538 = (int *)local_598;
                        uStack_530 = pGVar19->userPtr;
                        local_528 = context->user;
                        local_520 = ray;
                        local_518 = (RTCHitN *)local_348;
                        local_510 = 4;
                        p_Var69 = pGVar19->occlusionFilterN;
                        if (p_Var69 != (RTCFilterFunctionN)0x0) {
                          p_Var69 = (RTCFilterFunctionN)
                                    (*p_Var69)((RTCFilterFunctionNArguments *)local_538);
                        }
                        auVar157._0_4_ = -(uint)(local_598._0_4_ == 0);
                        auVar157._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar157._8_4_ = -(uint)(local_598._8_4_ == 0);
                        auVar157._12_4_ = -(uint)(local_598._12_4_ == 0);
                        uVar79 = movmskps((int)p_Var69,auVar157);
                        pRVar67 = (RayK<4> *)(ulong)(uVar79 ^ 0xf);
                        if ((uVar79 ^ 0xf) == 0) {
                          auVar157 = auVar157 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar71 = context->args;
                          if (((RTCIntersectArguments *)pRVar71->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar71->flags & 2) != 0 ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar71->filter)(local_538);
                          }
                          auVar119._0_4_ = -(uint)(local_598._0_4_ == 0);
                          auVar119._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar119._8_4_ = -(uint)(local_598._8_4_ == 0);
                          auVar119._12_4_ = -(uint)(local_598._12_4_ == 0);
                          auVar157 = auVar119 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_520 + 0x80) =
                               ~auVar119 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_520 + 0x80) & auVar119;
                          pRVar67 = local_520;
                        }
                        auVar158._0_4_ = auVar157._0_4_ << 0x1f;
                        auVar158._4_4_ = auVar157._4_4_ << 0x1f;
                        auVar158._8_4_ = auVar157._8_4_ << 0x1f;
                        auVar158._12_4_ = auVar157._12_4_ << 0x1f;
                        iVar62 = movmskps((int)pRVar67,auVar158);
                        uVar66 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar67 >> 0x20),iVar62) >> 8
                                                ),iVar62 != 0);
                        if (iVar62 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar175;
                        }
                      }
                      goto LAB_00ae216d;
                    }
                  }
                  uVar66 = 0;
                  goto LAB_00ae216d;
                }
                bVar78 = uVar75 < 4;
                uVar75 = uVar75 + 1;
              } while (uVar75 != 5);
              bVar78 = false;
              uVar66 = 5;
LAB_00ae216d:
              uVar63 = SUB84(pRVar71,0);
              fVar228 = *(float *)(ray + k * 4 + 0x80);
              local_3b8._0_4_ = -(uint)(local_638 <= fVar228) & local_3b8._0_4_;
              local_3b8._4_4_ = -(uint)(fStack_634 <= fVar228) & local_3b8._4_4_;
              local_3b8._8_4_ = -(uint)(fStack_630 <= fVar228) & local_3b8._8_4_;
              local_3b8._12_4_ = -(uint)(fStack_62c <= fVar228) & local_3b8._12_4_;
              bVar74 = (bool)(bVar74 | bVar78 & (byte)uVar66);
              uVar70 = (undefined4)((ulong)uVar66 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_3b8);
            } while (iVar62 != 0);
          }
          auVar241._0_4_ =
               local_578._0_4_ & local_3d8._0_4_ &
               -(uint)(local_568 + (float)local_138._0_4_ <= fVar228);
          auVar241._4_4_ =
               local_578._4_4_ & local_3d8._4_4_ &
               -(uint)(fStack_564 + (float)local_138._4_4_ <= fVar228);
          auVar241._8_4_ =
               (uint)fStack_570 & (uint)fStack_3d0 & -(uint)(fStack_560 + fStack_130 <= fVar228);
          auVar241._12_4_ =
               (uint)fStack_56c & (uint)fStack_3cc & -(uint)(fStack_55c + fStack_12c <= fVar228);
          auVar172._0_4_ =
               auVar116._0_4_ & local_588._0_4_ &
               -(uint)(local_568 + (float)local_2b8._0_4_ <= fVar228);
          auVar172._4_4_ =
               auVar116._4_4_ & local_588._4_4_ &
               -(uint)(fStack_564 + (float)local_2b8._4_4_ <= fVar228);
          auVar172._8_4_ =
               auVar116._8_4_ & (uint)fStack_580 & -(uint)(fStack_560 + fStack_2b0 <= fVar228);
          auVar172._12_4_ =
               auVar116._12_4_ & (uint)fStack_57c & -(uint)(fStack_55c + fStack_2ac <= fVar228);
          iVar62 = movmskps(0,auVar172 | auVar241);
          if (iVar62 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar77 * 0x30) = auVar172 | auVar241;
            auStack_e8[uVar77 * 0xc] =
                 ~auVar241._0_4_ & local_2b8._0_4_ | local_138._0_4_ & auVar241._0_4_;
            auStack_e8[uVar77 * 0xc + 1] =
                 ~auVar241._4_4_ & local_2b8._4_4_ | local_138._4_4_ & auVar241._4_4_;
            auStack_e8[uVar77 * 0xc + 2] =
                 ~auVar241._8_4_ & (uint)fStack_2b0 | (uint)fStack_130 & auVar241._8_4_;
            auStack_e8[uVar77 * 0xc + 3] =
                 ~auVar241._12_4_ & (uint)fStack_2ac | (uint)fStack_12c & auVar241._12_4_;
            (&uStack_d8)[uVar77 * 6] = CONCAT44(fStack_1f4,local_1f8);
            aiStack_d0[uVar77 * 0xc] = (int)fVar160 + 1;
            iVar76 = iVar76 + 1;
          }
        }
      }
    }
    if (iVar76 == 0) break;
    fVar160 = *(float *)(ray + k * 4 + 0x80);
    uVar80 = -iVar76;
    pauVar68 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar76 - 1) * 0x30);
    uVar79 = uVar80;
    while( true ) {
      auVar153._0_4_ = -(uint)(local_568 + *(float *)pauVar68[1] <= fVar160) & *(uint *)*pauVar68;
      auVar153._4_4_ =
           -(uint)(fStack_564 + *(float *)(pauVar68[1] + 4) <= fVar160) & *(uint *)(*pauVar68 + 4);
      auVar153._8_4_ =
           -(uint)(fStack_560 + *(float *)(pauVar68[1] + 8) <= fVar160) & *(uint *)(*pauVar68 + 8);
      auVar153._12_4_ =
           -(uint)(fStack_55c + *(float *)(pauVar68[1] + 0xc) <= fVar160) &
           *(uint *)(*pauVar68 + 0xc);
      _local_348 = auVar153;
      iVar62 = movmskps(uVar79,auVar153);
      if (iVar62 != 0) break;
      pauVar68 = pauVar68 + -3;
      uVar80 = uVar80 + 1;
      uVar79 = 0;
      if (uVar80 == 0) {
        uVar63 = 0;
        goto LAB_00ae25d8;
      }
    }
    auVar170._0_4_ = (uint)*(float *)pauVar68[1] & auVar153._0_4_;
    auVar170._4_4_ = (uint)*(float *)(pauVar68[1] + 4) & auVar153._4_4_;
    auVar170._8_4_ = (uint)*(float *)(pauVar68[1] + 8) & auVar153._8_4_;
    auVar170._12_4_ = (uint)*(float *)(pauVar68[1] + 0xc) & auVar153._12_4_;
    auVar189._0_8_ = CONCAT44(~auVar153._4_4_,~auVar153._0_4_) & 0x7f8000007f800000;
    auVar189._8_4_ = ~auVar153._8_4_ & 0x7f800000;
    auVar189._12_4_ = ~auVar153._12_4_ & 0x7f800000;
    auVar189 = auVar189 | auVar170;
    auVar171._4_4_ = auVar189._0_4_;
    auVar171._0_4_ = auVar189._4_4_;
    auVar171._8_4_ = auVar189._12_4_;
    auVar171._12_4_ = auVar189._8_4_;
    auVar85 = minps(auVar171,auVar189);
    auVar114._0_8_ = auVar85._8_8_;
    auVar114._8_4_ = auVar85._0_4_;
    auVar114._12_4_ = auVar85._4_4_;
    auVar85 = minps(auVar114,auVar85);
    auVar115._0_8_ =
         CONCAT44(-(uint)(auVar85._4_4_ == auVar189._4_4_) & auVar153._4_4_,
                  -(uint)(auVar85._0_4_ == auVar189._0_4_) & auVar153._0_4_);
    auVar115._8_4_ = -(uint)(auVar85._8_4_ == auVar189._8_4_) & auVar153._8_4_;
    auVar115._12_4_ = -(uint)(auVar85._12_4_ == auVar189._12_4_) & auVar153._12_4_;
    iVar62 = movmskps(iVar62,auVar115);
    if (iVar62 != 0) {
      auVar153._8_4_ = auVar115._8_4_;
      auVar153._0_8_ = auVar115._0_8_;
      auVar153._12_4_ = auVar115._12_4_;
    }
    uVar66 = *(undefined8 *)pauVar68[2];
    fVar160 = *(float *)(pauVar68[2] + 8);
    uVar79 = movmskps(iVar62,auVar153);
    pRVar71 = (RTCIntersectArguments *)0x0;
    if (uVar79 != 0) {
      for (; (uVar79 >> (long)pRVar71 & 1) == 0;
          pRVar71 = (RTCIntersectArguments *)((long)&pRVar71->flags + 1)) {
      }
    }
    *(undefined4 *)(local_348 + (long)pRVar71 * 4) = 0;
    *pauVar68 = _local_348;
    iVar62 = movmskps((int)pauVar68,_local_348);
    lVar65 = CONCAT44((int)((ulong)pauVar68 >> 0x20),iVar62);
    uVar79 = ~uVar80;
    if (iVar62 != 0) {
      uVar79 = -uVar80;
    }
    uVar77 = (ulong)uVar79;
    fVar162 = (float)uVar66;
    fVar173 = (float)((ulong)uVar66 >> 0x20) - fVar162;
    _local_538 = (int *)CONCAT44(fVar173 * 0.33333334 + fVar162,fVar173 * 0.0 + fVar162);
    uStack_530 = (void *)CONCAT44(fVar173 * 1.0 + fVar162,fVar173 * 0.6666667 + fVar162);
    local_1f8 = *(float *)(local_538 + (long)pRVar71 * 4);
    fStack_1f4 = *(float *)(local_538 + (long)pRVar71 * 4 + 4);
  } while( true );
LAB_00ae25d8:
  if (bVar74 != false) {
    return bVar74;
  }
  fVar174 = *(float *)(ray + k * 4 + 0x80);
  auVar159._4_4_ = -(uint)(fStack_294 <= fVar174);
  auVar159._0_4_ = -(uint)(local_298 <= fVar174);
  auVar159._8_4_ = -(uint)(fStack_290 <= fVar174);
  auVar159._12_4_ = -(uint)(fStack_28c <= fVar174);
  uVar79 = movmskps(uVar63,auVar159);
  uVar79 = (uint)local_390 - 1 & (uint)local_390 & uVar79;
  if (uVar79 == 0) {
    return false;
  }
  goto LAB_00adfe12;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }